

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalJacobianContIntDamping
          (ChElementHexaANCF_3843 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  long lVar1;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  element_type *peVar50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar51;
  PointerType pdVar52;
  long lVar53;
  long lVar54;
  double dVar55;
  long lVar56;
  long lVar57;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *pPVar78;
  long lVar79;
  DenseStorage<double,__1,__1,__1,_1> *pDVar80;
  int i;
  long lVar81;
  undefined1 (*pauVar82) [64];
  char *pcVar83;
  double dVar84;
  Index col_1;
  ulong uVar85;
  PointerType pdVar86;
  long lVar87;
  undefined1 (*pauVar88) [64];
  double dVar89;
  long lVar90;
  Index row;
  long lVar91;
  Matrix<double,_192,_6,_0,_192,_6> *pMVar92;
  ulong uVar93;
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TVar94;
  double *pdVar95;
  double *pdVar96;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar97;
  Scalar *alpha;
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  VectorNIP E_BlockDamping;
  DstEvaluatorType dstEvaluator;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  VectorNIP E4_Block;
  VectorNIP E5_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP E6_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  ChVectorN<double,_(NSF_*_(NSF___1))___2> ScaledMassMatrix;
  ChMatrixNM<double,_NSF,_3_*_NIP> S_scaled_SD;
  MatrixNx6 ebar_ebardot;
  DenseStorage<double,__1,__1,__1,_1> DStack_133e0;
  DenseStorage<double,__1,__1,__1,_1> DStack_133c0;
  double dStack_133a0;
  undefined1 *puStack_13398;
  DenseStorage<double,__1,__1,__1,_1> DStack_13390;
  double dStack_13370;
  undefined1 *puStack_13368;
  double dStack_13360;
  double dStack_13358;
  double dStack_13350;
  undefined1 *puStack_13348;
  undefined1 auStack_13340 [128];
  undefined1 auStack_132c0 [64];
  undefined1 auStack_13280 [64];
  undefined1 auStack_13240 [64];
  undefined1 auStack_13200 [64];
  undefined1 auStack_131c0 [64];
  undefined1 auStack_13180 [64];
  undefined1 auStack_13140 [64];
  undefined1 auStack_13100 [64];
  undefined1 auStack_130c0 [64];
  undefined1 auStack_13080 [64];
  undefined1 auStack_13040 [64];
  undefined1 auStack_13000 [64];
  undefined1 auStack_12fc0 [64];
  undefined1 auStack_12f80 [64];
  undefined1 auStack_12f40 [64];
  undefined1 auStack_12f00 [64];
  undefined1 auStack_12ec0 [64];
  undefined1 auStack_12e80 [64];
  undefined1 auStack_12e40 [64];
  double *pdStack_12e00;
  double dStack_12df8;
  double dStack_12df0;
  double dStack_12de8;
  double dStack_12de0;
  double dStack_12dd8;
  double dStack_12dd0;
  double dStack_12dc8;
  double *pdStack_12dc0;
  double dStack_12db8;
  double dStack_12db0;
  double dStack_12da8;
  double dStack_12da0;
  double dStack_12d98;
  double dStack_12d90;
  double dStack_12d88;
  double dStack_12d80;
  double dStack_12d78;
  double dStack_12d70;
  double dStack_12d68;
  double dStack_12d60;
  double dStack_12d58;
  double dStack_12d50;
  double dStack_12d48;
  PointerType pdStack_12d40;
  double dStack_12d38;
  double dStack_12d30;
  double dStack_12d28;
  double dStack_12d20;
  double dStack_12d18;
  double dStack_12d10;
  double dStack_12d08;
  ChElementHexaANCF_3843 *pCStack_12d00;
  double dStack_12cf8;
  double dStack_12cf0;
  double dStack_12ce8;
  double dStack_12ce0;
  double dStack_12cd8;
  double dStack_12cd0;
  double dStack_12cc8;
  bool bStack_12cc0;
  undefined7 uStack_12cbf;
  double dStack_12cb8;
  double dStack_12cb0;
  double dStack_12ca8;
  double dStack_12ca0;
  double dStack_12c98;
  double dStack_12c90;
  double dStack_12c88;
  double dStack_12c80;
  double dStack_12c78;
  double dStack_12c70;
  double dStack_12c68;
  double dStack_12c60;
  double dStack_12c58;
  double dStack_12c50;
  double dStack_12c48;
  undefined1 (*pauStack_12c40) [64];
  undefined1 *puStack_12c38;
  double dStack_12c30;
  double dStack_12c28;
  double dStack_12c20;
  double dStack_12c18;
  double dStack_12c10;
  double dStack_12c08;
  undefined1 auStack_12c00 [128];
  undefined1 auStack_12b80 [64];
  undefined1 auStack_12b40 [64];
  undefined1 auStack_12b00 [64];
  undefined1 auStack_12ac0 [64];
  undefined1 auStack_12a80 [64];
  undefined1 auStack_12a40 [64];
  undefined1 auStack_12a00 [64];
  undefined1 auStack_129c0 [64];
  undefined1 auStack_12980 [64];
  undefined1 auStack_12940 [64];
  undefined1 auStack_12900 [64];
  undefined1 auStack_128c0 [64];
  undefined1 auStack_12880 [64];
  undefined1 auStack_12840 [64];
  undefined1 auStack_12800 [64];
  undefined1 auStack_127c0 [64];
  undefined1 auStack_12780 [64];
  undefined1 auStack_12740 [64];
  undefined1 auStack_12700 [64];
  undefined1 auStack_126c0 [64];
  undefined1 auStack_12680 [64];
  undefined1 auStack_12640 [64];
  undefined1 auStack_12600 [64];
  undefined1 auStack_125c0 [64];
  undefined1 auStack_12580 [64];
  undefined1 auStack_12540 [64];
  undefined1 auStack_12500 [64];
  undefined1 auStack_124c0 [64];
  undefined1 auStack_12480 [64];
  undefined1 auStack_12440 [64];
  undefined1 auStack_12400 [64];
  undefined1 auStack_123c0 [64];
  undefined1 auStack_12380 [64];
  undefined1 auStack_12340 [64];
  undefined1 auStack_12300 [64];
  undefined1 auStack_122c0 [64];
  undefined1 auStack_12280 [64];
  undefined1 auStack_12240 [64];
  undefined1 auStack_12200 [64];
  undefined1 auStack_121c0 [64];
  undefined1 auStack_12180 [64];
  undefined1 auStack_12140 [64];
  undefined1 auStack_12100 [64];
  undefined1 auStack_120c0 [64];
  undefined1 auStack_12080 [64];
  undefined1 auStack_12040 [64];
  undefined1 auStack_12000 [64];
  undefined1 auStack_11fc0 [64];
  undefined1 auStack_11f80 [64];
  undefined1 auStack_11f40 [64];
  undefined1 auStack_11f00 [64];
  undefined1 auStack_11ec0 [64];
  undefined1 auStack_11e80 [64];
  undefined1 auStack_11e40 [64];
  undefined1 auStack_11e00 [64];
  undefined1 auStack_11dc0 [64];
  undefined1 auStack_11d80 [64];
  undefined1 auStack_11d40 [64];
  undefined1 auStack_11d00 [64];
  undefined1 auStack_11cc0 [64];
  undefined1 auStack_11c80 [64];
  undefined1 auStack_11c40 [64];
  undefined1 auStack_11c00 [64];
  undefined1 auStack_11bc0 [64];
  undefined1 auStack_11b80 [64];
  undefined1 auStack_11b40 [64];
  undefined1 auStack_11b00 [64];
  undefined1 auStack_11ac0 [64];
  undefined1 auStack_11a80 [64];
  undefined1 auStack_11a40 [64];
  undefined1 auStack_11a00 [64];
  undefined1 auStack_119c0 [64];
  undefined1 auStack_11980 [64];
  undefined1 auStack_11940 [64];
  undefined1 auStack_11900 [64];
  undefined1 auStack_118c0 [64];
  undefined1 auStack_11880 [64];
  undefined1 auStack_11840 [64];
  undefined1 auStack_11800 [64];
  undefined1 auStack_117c0 [64];
  undefined1 auStack_11780 [64];
  undefined1 auStack_11740 [64];
  undefined1 auStack_11700 [64];
  undefined1 auStack_116c0 [64];
  undefined1 auStack_11680 [64];
  undefined1 auStack_11640 [64];
  undefined1 auStack_11600 [64];
  undefined1 auStack_115c0 [64];
  undefined1 auStack_11580 [64];
  undefined1 auStack_11540 [64];
  undefined1 auStack_11500 [64];
  undefined1 auStack_114c0 [64];
  undefined1 auStack_11480 [64];
  undefined1 auStack_11440 [64];
  undefined1 auStack_11400 [64];
  undefined1 auStack_113c0 [64];
  undefined1 auStack_11380 [64];
  undefined1 auStack_11340 [64];
  undefined1 auStack_11300 [64];
  undefined1 auStack_112c0 [64];
  undefined1 auStack_11280 [64];
  undefined1 auStack_11240 [64];
  undefined1 auStack_11200 [64];
  undefined1 auStack_111c0 [64];
  undefined1 auStack_11180 [64];
  undefined1 auStack_11140 [64];
  undefined1 auStack_11100 [64];
  undefined1 auStack_110c0 [64];
  undefined1 auStack_11080 [64];
  undefined1 auStack_11040 [64];
  undefined1 auStack_11000 [64];
  undefined1 auStack_10fc0 [64];
  undefined1 auStack_10f80 [64];
  undefined1 auStack_10f40 [64];
  undefined1 auStack_10f00 [64];
  undefined1 auStack_10ec0 [64];
  undefined1 auStack_10e80 [64];
  undefined1 auStack_10e40 [64];
  undefined1 auStack_10e00 [64];
  undefined1 auStack_10dc0 [64];
  undefined1 auStack_10d80 [64];
  undefined1 auStack_10d40 [64];
  undefined1 auStack_10d00 [64];
  undefined1 auStack_10cc0 [64];
  undefined1 auStack_10c80 [64];
  undefined1 auStack_10c40 [64];
  undefined1 auStack_10c00 [64];
  undefined1 auStack_10bc0 [64];
  undefined1 auStack_10b80 [64];
  undefined1 auStack_10b40 [64];
  undefined1 auStack_10b00 [64];
  undefined1 auStack_10ac0 [64];
  undefined1 auStack_10a80 [64];
  undefined1 auStack_10a40 [64];
  undefined1 auStack_10a00 [64];
  undefined1 auStack_109c0 [64];
  undefined1 auStack_10980 [64];
  undefined1 auStack_10940 [64];
  undefined1 auStack_10900 [64];
  undefined1 auStack_108c0 [64];
  undefined1 auStack_10880 [64];
  undefined1 auStack_10840 [64];
  Scalar SStack_10800;
  undefined1 auStack_107f8 [56];
  undefined1 auStack_107c0 [64];
  undefined1 auStack_10780 [64];
  undefined1 auStack_10740 [64];
  undefined1 auStack_10700 [64];
  undefined1 auStack_106c0 [64];
  undefined1 auStack_10680 [64];
  undefined1 auStack_10640 [64];
  undefined1 auStack_10600 [64];
  undefined1 auStack_105c0 [64];
  undefined1 auStack_10580 [64];
  undefined1 auStack_10540 [64];
  undefined1 auStack_10500 [64];
  undefined1 auStack_104c0 [64];
  undefined1 auStack_10480 [64];
  undefined1 auStack_10440 [64];
  undefined1 auStack_10400 [64];
  undefined1 auStack_103c0 [64];
  undefined1 auStack_10380 [64];
  undefined1 auStack_10340 [64];
  undefined1 auStack_10300 [64];
  undefined1 auStack_102c0 [64];
  undefined1 auStack_10280 [64];
  undefined1 auStack_10240 [64];
  undefined1 auStack_10200 [64];
  undefined1 auStack_101c0 [64];
  undefined1 auStack_10180 [64];
  undefined1 auStack_10140 [64];
  undefined1 auStack_10100 [64];
  undefined1 auStack_100c0 [64];
  undefined1 auStack_10080 [64];
  undefined1 auStack_10040 [64];
  undefined1 local_10000 [64];
  undefined1 local_ffc0 [64];
  undefined1 local_ff80 [64];
  undefined1 local_ff40 [64];
  undefined1 local_ff00 [64];
  undefined1 local_fec0 [64];
  undefined1 local_fe80 [64];
  undefined1 local_fe40 [64];
  undefined1 local_fe00 [64];
  undefined1 local_fdc0 [64];
  undefined1 local_fd80 [64];
  undefined1 local_fd40 [64];
  undefined1 local_fd00 [64];
  undefined1 local_fcc0 [64];
  undefined1 local_fc80 [64];
  undefined1 local_fc40 [64];
  undefined1 local_fc00 [64];
  undefined1 local_fbc0 [64];
  undefined1 local_fb80 [64];
  undefined1 local_fb40 [64];
  undefined1 local_fb00 [64];
  undefined1 local_fac0 [64];
  undefined1 local_fa80 [64];
  undefined1 local_fa40 [64];
  undefined1 local_fa00 [64];
  undefined1 local_f9c0 [64];
  undefined1 local_f980 [64];
  undefined1 local_f940 [64];
  undefined1 local_f900 [64];
  undefined1 local_f8c0 [64];
  undefined1 local_f880 [64];
  undefined1 local_f840 [64];
  undefined1 local_f800 [64];
  undefined1 local_f7c0 [64];
  undefined1 local_f780 [64];
  undefined1 local_f740 [64];
  undefined1 local_f700 [64];
  undefined1 local_f6c0 [64];
  undefined1 local_f680 [64];
  undefined1 local_f640 [64];
  undefined1 local_f600 [64];
  undefined1 local_f5c0 [64];
  undefined1 local_f580 [64];
  undefined1 local_f540 [64];
  undefined1 local_f500 [64];
  undefined1 local_f4c0 [64];
  undefined1 local_f480 [64];
  undefined1 local_f440 [64];
  undefined1 local_f400 [64];
  undefined1 local_f3c0 [64];
  undefined1 local_f380 [64];
  undefined1 local_f340 [64];
  undefined1 local_f300 [64];
  undefined1 local_f2c0 [64];
  undefined1 local_f280 [64];
  undefined1 local_f240 [64];
  undefined1 local_f200 [64];
  undefined1 local_f1c0 [64];
  undefined1 local_f180 [64];
  undefined1 local_f140 [64];
  undefined1 local_f100 [64];
  undefined1 local_f0c0 [64];
  undefined1 local_f080 [64];
  undefined1 local_f040 [64];
  undefined1 local_f000 [64];
  undefined1 local_efc0 [64];
  undefined1 local_ef80 [64];
  undefined1 local_ef40 [64];
  undefined1 local_ef00 [64];
  undefined1 local_eec0 [64];
  undefined1 local_ee80 [64];
  undefined1 local_ee40 [64];
  undefined1 (*local_ee00) [64];
  undefined1 *puStack_edf8;
  double dStack_edf0;
  double dStack_ede8;
  double dStack_ede0;
  double dStack_edd8;
  double dStack_edd0;
  double dStack_edc8;
  double local_edc0;
  double dStack_edb8;
  double dStack_edb0;
  double dStack_eda8;
  double dStack_eda0;
  double dStack_ed98;
  double dStack_ed90;
  double dStack_ed88;
  undefined8 local_ed80;
  double dStack_ed78;
  double dStack_ed70;
  double dStack_ed68;
  double dStack_ed60;
  double dStack_ed58;
  double dStack_ed50;
  double dStack_ed48;
  ChElementHexaANCF_3843 *local_ed40;
  double dStack_ed38;
  double dStack_ed30;
  double dStack_ed28;
  double dStack_ed20;
  double dStack_ed18;
  double dStack_ed10;
  double dStack_ed08;
  PointerType local_ed00;
  double dStack_ecf8;
  double dStack_ecf0;
  double dStack_ece8;
  double dStack_ece0;
  double dStack_ecd8;
  double dStack_ecd0;
  double dStack_ecc8;
  double local_ecc0;
  double dStack_ecb8;
  double dStack_ecb0;
  double dStack_eca8;
  double dStack_eca0;
  double dStack_ec98;
  double dStack_ec90;
  double dStack_ec88;
  double *local_ec80;
  double dStack_ec78;
  double dStack_ec70;
  double dStack_ec68;
  double dStack_ec60;
  double dStack_ec58;
  double dStack_ec50;
  double dStack_ec48;
  double *local_ec40;
  double dStack_ec38;
  double dStack_ec30;
  double dStack_ec28;
  double dStack_ec20;
  double dStack_ec18;
  double dStack_ec10;
  double dStack_ec08;
  double local_ec00;
  undefined1 *puStack_ebf8;
  undefined1 auStack_ebf0 [48];
  undefined1 local_ebc0 [64];
  undefined1 local_eb80 [64];
  undefined1 local_eb40 [64];
  undefined1 local_eb00 [64];
  undefined1 local_eac0 [64];
  undefined1 local_ea80 [64];
  undefined1 local_ea40 [64];
  double local_ea00;
  undefined1 *puStack_e9f8;
  undefined8 uStack_e9f0;
  undefined8 uStack_e9e8;
  undefined8 uStack_e9e0;
  undefined8 uStack_e9d8;
  undefined8 uStack_e9d0;
  undefined8 uStack_e9c8;
  undefined8 local_e9c0;
  undefined8 uStack_e9b8;
  undefined8 uStack_e9b0;
  undefined8 uStack_e9a8;
  undefined8 uStack_e9a0;
  undefined8 uStack_e998;
  undefined8 uStack_e990;
  undefined8 uStack_e988;
  undefined8 local_e980;
  undefined8 uStack_e978;
  undefined8 uStack_e970;
  undefined8 uStack_e968;
  undefined8 uStack_e960;
  undefined8 uStack_e958;
  undefined8 uStack_e950;
  undefined8 uStack_e948;
  undefined8 local_e940;
  undefined8 uStack_e938;
  undefined8 uStack_e930;
  undefined8 uStack_e928;
  undefined8 uStack_e920;
  undefined8 uStack_e918;
  undefined8 uStack_e910;
  undefined8 uStack_e908;
  undefined8 local_e900;
  undefined8 uStack_e8f8;
  undefined8 uStack_e8f0;
  undefined8 uStack_e8e8;
  undefined8 uStack_e8e0;
  undefined8 uStack_e8d8;
  undefined8 uStack_e8d0;
  undefined8 uStack_e8c8;
  undefined8 local_e8c0;
  undefined8 uStack_e8b8;
  undefined8 uStack_e8b0;
  undefined8 uStack_e8a8;
  undefined8 uStack_e8a0;
  undefined8 uStack_e898;
  undefined8 uStack_e890;
  undefined8 uStack_e888;
  undefined8 local_e880;
  undefined8 uStack_e878;
  undefined8 uStack_e870;
  undefined8 uStack_e868;
  undefined8 uStack_e860;
  undefined8 uStack_e858;
  undefined8 uStack_e850;
  undefined8 uStack_e848;
  undefined8 local_e840;
  undefined8 uStack_e838;
  undefined8 uStack_e830;
  undefined8 uStack_e828;
  undefined8 uStack_e820;
  undefined8 uStack_e818;
  undefined8 uStack_e810;
  undefined8 uStack_e808;
  undefined1 local_e800 [64];
  undefined1 local_e7c0 [64];
  undefined1 local_e780 [64];
  undefined1 local_e740 [64];
  undefined1 local_e700 [64];
  undefined1 local_e6c0 [64];
  undefined1 local_e680 [64];
  undefined1 local_e640 [64];
  undefined1 local_e600 [64];
  undefined1 local_e5c0 [64];
  undefined1 local_e580 [64];
  undefined1 local_e540 [64];
  undefined8 local_e500;
  undefined8 uStack_e4f8;
  undefined8 uStack_e4f0;
  undefined8 uStack_e4e8;
  undefined8 uStack_e4e0;
  undefined8 uStack_e4d8;
  undefined8 uStack_e4d0;
  undefined8 uStack_e4c8;
  undefined8 local_e4c0;
  undefined8 uStack_e4b8;
  undefined8 uStack_e4b0;
  undefined8 uStack_e4a8;
  undefined8 uStack_e4a0;
  undefined8 uStack_e498;
  undefined8 uStack_e490;
  undefined8 uStack_e488;
  undefined8 local_e480;
  undefined8 uStack_e478;
  undefined8 uStack_e470;
  undefined8 uStack_e468;
  undefined8 uStack_e460;
  undefined8 uStack_e458;
  undefined8 uStack_e450;
  undefined8 uStack_e448;
  undefined8 local_e440;
  undefined8 uStack_e438;
  undefined8 uStack_e430;
  undefined8 uStack_e428;
  undefined8 uStack_e420;
  undefined8 uStack_e418;
  undefined8 uStack_e410;
  undefined8 uStack_e408;
  undefined8 local_e400;
  undefined8 uStack_e3f8;
  undefined8 uStack_e3f0;
  undefined8 uStack_e3e8;
  undefined8 uStack_e3e0;
  undefined8 uStack_e3d8;
  undefined8 uStack_e3d0;
  undefined8 uStack_e3c8;
  undefined8 local_e3c0;
  undefined8 uStack_e3b8;
  undefined8 uStack_e3b0;
  undefined8 uStack_e3a8;
  undefined8 uStack_e3a0;
  undefined8 uStack_e398;
  undefined8 uStack_e390;
  undefined8 uStack_e388;
  undefined8 local_e380;
  undefined8 uStack_e378;
  undefined8 uStack_e370;
  undefined8 uStack_e368;
  undefined8 uStack_e360;
  undefined8 uStack_e358;
  undefined8 uStack_e350;
  undefined8 uStack_e348;
  double local_e340;
  undefined1 *puStack_e338;
  undefined8 uStack_e330;
  undefined8 uStack_e328;
  undefined8 uStack_e320;
  undefined8 uStack_e318;
  undefined8 uStack_e310;
  undefined8 uStack_e308;
  undefined8 local_e300;
  undefined8 uStack_e2f8;
  undefined8 uStack_e2f0;
  undefined8 uStack_e2e8;
  undefined8 uStack_e2e0;
  undefined8 uStack_e2d8;
  undefined8 uStack_e2d0;
  undefined8 uStack_e2c8;
  undefined8 local_e2c0;
  undefined8 uStack_e2b8;
  undefined8 uStack_e2b0;
  undefined8 uStack_e2a8;
  undefined8 uStack_e2a0;
  undefined8 uStack_e298;
  undefined8 uStack_e290;
  undefined8 uStack_e288;
  undefined8 local_e280;
  undefined8 uStack_e278;
  undefined8 uStack_e270;
  undefined8 uStack_e268;
  undefined8 uStack_e260;
  undefined8 uStack_e258;
  undefined8 uStack_e250;
  undefined8 uStack_e248;
  undefined8 local_e240;
  undefined8 uStack_e238;
  undefined8 uStack_e230;
  undefined8 uStack_e228;
  undefined8 uStack_e220;
  undefined8 uStack_e218;
  undefined8 uStack_e210;
  undefined8 uStack_e208;
  undefined8 local_e200;
  undefined8 uStack_e1f8;
  undefined8 uStack_e1f0;
  undefined8 uStack_e1e8;
  undefined8 uStack_e1e0;
  undefined8 uStack_e1d8;
  undefined8 uStack_e1d0;
  undefined8 uStack_e1c8;
  undefined8 local_e1c0;
  undefined8 uStack_e1b8;
  undefined8 uStack_e1b0;
  undefined8 uStack_e1a8;
  undefined8 uStack_e1a0;
  undefined8 uStack_e198;
  undefined8 uStack_e190;
  undefined8 uStack_e188;
  undefined8 local_e180;
  undefined8 uStack_e178;
  undefined8 uStack_e170;
  undefined8 uStack_e168;
  undefined8 uStack_e160;
  undefined8 uStack_e158;
  undefined8 uStack_e150;
  undefined8 uStack_e148;
  undefined8 local_e140;
  undefined8 uStack_e138;
  undefined8 uStack_e130;
  undefined8 uStack_e128;
  undefined8 uStack_e120;
  undefined8 uStack_e118;
  undefined8 uStack_e110;
  undefined8 uStack_e108;
  undefined8 local_e100;
  undefined8 uStack_e0f8;
  undefined8 uStack_e0f0;
  undefined8 uStack_e0e8;
  undefined8 uStack_e0e0;
  undefined8 uStack_e0d8;
  undefined8 uStack_e0d0;
  undefined8 uStack_e0c8;
  undefined8 local_e0c0;
  undefined8 uStack_e0b8;
  undefined8 uStack_e0b0;
  undefined8 uStack_e0a8;
  undefined8 uStack_e0a0;
  undefined8 uStack_e098;
  undefined8 uStack_e090;
  undefined8 uStack_e088;
  undefined8 local_e080;
  undefined8 uStack_e078;
  undefined8 uStack_e070;
  undefined8 uStack_e068;
  undefined8 uStack_e060;
  undefined8 uStack_e058;
  undefined8 uStack_e050;
  undefined8 uStack_e048;
  double local_e040;
  undefined1 *puStack_e038;
  undefined8 uStack_e030;
  undefined8 uStack_e028;
  undefined8 uStack_e020;
  undefined8 uStack_e018;
  undefined8 uStack_e010;
  undefined8 uStack_e008;
  undefined8 local_e000;
  undefined8 uStack_dff8;
  undefined8 uStack_dff0;
  undefined8 uStack_dfe8;
  undefined8 uStack_dfe0;
  undefined8 uStack_dfd8;
  undefined8 uStack_dfd0;
  undefined8 uStack_dfc8;
  undefined8 local_dfc0;
  undefined8 uStack_dfb8;
  undefined8 uStack_dfb0;
  undefined8 uStack_dfa8;
  undefined8 uStack_dfa0;
  undefined8 uStack_df98;
  undefined8 uStack_df90;
  undefined8 uStack_df88;
  undefined8 local_df80;
  undefined8 uStack_df78;
  undefined8 uStack_df70;
  undefined8 uStack_df68;
  undefined8 uStack_df60;
  undefined8 uStack_df58;
  undefined8 uStack_df50;
  undefined8 uStack_df48;
  double local_df40;
  undefined1 *puStack_df38;
  undefined8 uStack_df30;
  undefined8 uStack_df28;
  undefined8 uStack_df20;
  undefined8 uStack_df18;
  undefined8 uStack_df10;
  undefined8 uStack_df08;
  undefined8 local_df00;
  undefined8 uStack_def8;
  undefined8 uStack_def0;
  undefined8 uStack_dee8;
  undefined8 uStack_dee0;
  undefined8 uStack_ded8;
  undefined8 uStack_ded0;
  undefined8 uStack_dec8;
  undefined8 local_dec0;
  undefined8 uStack_deb8;
  undefined8 uStack_deb0;
  undefined8 uStack_dea8;
  undefined8 uStack_dea0;
  undefined8 uStack_de98;
  undefined8 uStack_de90;
  undefined8 uStack_de88;
  undefined8 local_de80;
  undefined8 uStack_de78;
  undefined8 uStack_de70;
  undefined8 uStack_de68;
  undefined8 uStack_de60;
  undefined8 uStack_de58;
  undefined8 uStack_de50;
  undefined8 uStack_de48;
  undefined8 local_de40;
  undefined8 uStack_de38;
  undefined8 uStack_de30;
  undefined8 uStack_de28;
  undefined8 uStack_de20;
  undefined8 uStack_de18;
  undefined8 uStack_de10;
  undefined8 uStack_de08;
  undefined8 local_de00;
  undefined8 uStack_ddf8;
  undefined8 uStack_ddf0;
  undefined8 uStack_dde8;
  undefined8 uStack_dde0;
  undefined8 uStack_ddd8;
  undefined8 uStack_ddd0;
  undefined8 uStack_ddc8;
  undefined8 local_ddc0;
  undefined8 uStack_ddb8;
  undefined8 uStack_ddb0;
  undefined8 uStack_dda8;
  undefined8 uStack_dda0;
  undefined8 uStack_dd98;
  undefined8 uStack_dd90;
  undefined8 uStack_dd88;
  undefined8 local_dd80;
  undefined8 uStack_dd78;
  undefined8 uStack_dd70;
  undefined8 uStack_dd68;
  undefined8 uStack_dd60;
  undefined8 uStack_dd58;
  undefined8 uStack_dd50;
  undefined8 uStack_dd48;
  undefined8 local_dd40;
  undefined8 uStack_dd38;
  undefined8 uStack_dd30;
  undefined8 uStack_dd28;
  undefined8 uStack_dd20;
  undefined8 uStack_dd18;
  undefined8 uStack_dd10;
  undefined8 uStack_dd08;
  double local_dd00;
  undefined1 *puStack_dcf8;
  undefined8 uStack_dcf0;
  undefined8 uStack_dce8;
  undefined8 uStack_dce0;
  undefined8 uStack_dcd8;
  undefined8 uStack_dcd0;
  undefined8 uStack_dcc8;
  undefined8 local_dcc0;
  undefined8 uStack_dcb8;
  undefined8 uStack_dcb0;
  undefined8 uStack_dca8;
  undefined8 uStack_dca0;
  undefined8 uStack_dc98;
  undefined8 uStack_dc90;
  undefined8 uStack_dc88;
  undefined8 local_dc80;
  undefined8 uStack_dc78;
  undefined8 uStack_dc70;
  undefined8 uStack_dc68;
  undefined8 uStack_dc60;
  undefined8 uStack_dc58;
  undefined8 uStack_dc50;
  undefined8 uStack_dc48;
  undefined8 local_dc40;
  undefined8 uStack_dc38;
  undefined8 uStack_dc30;
  undefined8 uStack_dc28;
  undefined8 uStack_dc20;
  undefined8 uStack_dc18;
  undefined8 uStack_dc10;
  undefined8 uStack_dc08;
  undefined8 local_dc00;
  undefined8 uStack_dbf8;
  undefined8 uStack_dbf0;
  undefined8 uStack_dbe8;
  undefined8 uStack_dbe0;
  undefined8 uStack_dbd8;
  undefined8 uStack_dbd0;
  undefined8 uStack_dbc8;
  undefined8 local_dbc0;
  undefined8 uStack_dbb8;
  undefined8 uStack_dbb0;
  undefined8 uStack_dba8;
  undefined8 uStack_dba0;
  undefined8 uStack_db98;
  undefined8 uStack_db90;
  undefined8 uStack_db88;
  undefined8 local_db80;
  undefined8 uStack_db78;
  undefined8 uStack_db70;
  undefined8 uStack_db68;
  undefined8 uStack_db60;
  undefined8 uStack_db58;
  undefined8 uStack_db50;
  undefined8 uStack_db48;
  undefined8 local_db40;
  undefined8 uStack_db38;
  undefined8 uStack_db30;
  undefined8 uStack_db28;
  undefined8 uStack_db20;
  undefined8 uStack_db18;
  undefined8 uStack_db10;
  undefined8 uStack_db08;
  double local_db00;
  undefined1 *puStack_daf8;
  undefined8 uStack_daf0;
  undefined8 uStack_dae8;
  undefined8 uStack_dae0;
  undefined8 uStack_dad8;
  undefined8 uStack_dad0;
  undefined8 uStack_dac8;
  undefined8 local_dac0;
  undefined8 uStack_dab8;
  undefined8 uStack_dab0;
  undefined8 uStack_daa8;
  undefined8 uStack_daa0;
  undefined8 uStack_da98;
  undefined8 uStack_da90;
  undefined8 uStack_da88;
  undefined8 local_da80;
  undefined8 uStack_da78;
  undefined8 uStack_da70;
  undefined8 uStack_da68;
  undefined8 uStack_da60;
  undefined8 uStack_da58;
  undefined8 uStack_da50;
  undefined8 uStack_da48;
  undefined8 local_da40;
  undefined8 uStack_da38;
  undefined8 uStack_da30;
  undefined8 uStack_da28;
  undefined8 uStack_da20;
  undefined8 uStack_da18;
  undefined8 uStack_da10;
  undefined8 uStack_da08;
  undefined8 local_da00;
  undefined8 uStack_d9f8;
  undefined8 uStack_d9f0;
  undefined8 uStack_d9e8;
  undefined8 uStack_d9e0;
  undefined8 uStack_d9d8;
  undefined8 uStack_d9d0;
  undefined8 uStack_d9c8;
  undefined8 local_d9c0;
  undefined8 uStack_d9b8;
  undefined8 uStack_d9b0;
  undefined8 uStack_d9a8;
  undefined8 uStack_d9a0;
  undefined8 uStack_d998;
  undefined8 uStack_d990;
  undefined8 uStack_d988;
  undefined8 local_d980;
  undefined8 uStack_d978;
  undefined8 uStack_d970;
  undefined8 uStack_d968;
  undefined8 uStack_d960;
  undefined8 uStack_d958;
  undefined8 uStack_d950;
  undefined8 uStack_d948;
  undefined8 local_d940;
  undefined8 uStack_d938;
  undefined8 uStack_d930;
  undefined8 uStack_d928;
  undefined8 uStack_d920;
  undefined8 uStack_d918;
  undefined8 uStack_d910;
  undefined8 uStack_d908;
  undefined8 local_d900;
  undefined8 uStack_d8f8;
  undefined8 uStack_d8f0;
  undefined8 uStack_d8e8;
  undefined8 uStack_d8e0;
  undefined8 uStack_d8d8;
  undefined8 uStack_d8d0;
  undefined8 uStack_d8c8;
  undefined8 local_d8c0;
  undefined8 uStack_d8b8;
  undefined8 uStack_d8b0;
  undefined8 uStack_d8a8;
  undefined8 uStack_d8a0;
  undefined8 uStack_d898;
  undefined8 uStack_d890;
  undefined8 uStack_d888;
  undefined8 local_d880;
  undefined8 uStack_d878;
  undefined8 uStack_d870;
  undefined8 uStack_d868;
  undefined8 uStack_d860;
  undefined8 uStack_d858;
  undefined8 uStack_d850;
  undefined8 uStack_d848;
  undefined8 local_d840;
  undefined8 uStack_d838;
  undefined8 uStack_d830;
  undefined8 uStack_d828;
  undefined8 uStack_d820;
  undefined8 uStack_d818;
  undefined8 uStack_d810;
  undefined8 uStack_d808;
  undefined8 local_d800;
  undefined8 uStack_d7f8;
  undefined8 uStack_d7f0;
  undefined8 uStack_d7e8;
  undefined8 uStack_d7e0;
  undefined8 uStack_d7d8;
  undefined8 uStack_d7d0;
  undefined8 uStack_d7c8;
  undefined8 local_d7c0;
  undefined8 uStack_d7b8;
  undefined8 uStack_d7b0;
  undefined8 uStack_d7a8;
  undefined8 uStack_d7a0;
  undefined8 uStack_d798;
  undefined8 uStack_d790;
  undefined8 uStack_d788;
  undefined8 local_d780;
  undefined8 uStack_d778;
  undefined8 uStack_d770;
  undefined8 uStack_d768;
  undefined8 uStack_d760;
  undefined8 uStack_d758;
  undefined8 uStack_d750;
  undefined8 uStack_d748;
  undefined8 local_d740;
  undefined8 uStack_d738;
  undefined8 uStack_d730;
  undefined8 uStack_d728;
  undefined8 uStack_d720;
  undefined8 uStack_d718;
  undefined8 uStack_d710;
  undefined8 uStack_d708;
  undefined1 local_d700 [16];
  DenseStorage<double,__1,__1,__1,_1> *local_d6f0;
  variable_if_dynamic<long,__1> local_d6e8;
  variable_if_dynamic<long,__1> vStack_d6e0;
  ulong local_d6d8;
  undefined1 auStack_d6c0 [4160];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_c680;
  Matrix<double,_192,_6,_0,_192,_6> *pMStack_c678;
  long lStack_c670;
  double dStack_c650;
  double *local_c640 [2];
  ulong uStack_c630;
  double dStack_c620;
  double *pdStack_c610;
  ulong local_c600;
  double dStack_c5f0;
  double *pdStack_c5e0;
  ulong uStack_c5d0;
  double local_c5c0 [2];
  double *pdStack_c5b0;
  ulong uStack_c5a0;
  double dStack_c590;
  double *local_c580;
  ulong uStack_c570;
  double dStack_c560;
  double *pdStack_c550;
  ulong local_c540;
  undefined1 local_c0c0 [47680];
  
  auStack_13140._0_8_ = Rfactor;
  dStack_13360 = Kfactor;
  dStack_13358 = Mfactor;
  CalcCombinedCoordMatrix(this,(MatrixNx6 *)&stack0xfffffffffffff980);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 0x20) {
    pcVar83 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 32, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 32, 6, 1>, Option = 0]"
    ;
LAB_006f2b99:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar83);
  }
  local_c680.m_matrix = &this->m_SD;
  pMStack_c678 = (Matrix<double,_192,_6,_0,_192,_6> *)&stack0xfffffffffffff980;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0xc0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 192, 6, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 192, 6, 0>]"
                 );
  }
  pdVar95 = (double *)auStack_12c00;
  memset(pdVar95,0,0x2400);
  alpha = &SStack_10800;
  SStack_10800 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,32,6,1,32,6>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,192,6,0,192,6>>
            ((Matrix<double,_192,_6,_0,_192,_6> *)pdVar95,&local_c680,
             (Matrix<double,_32,_6,_1,_32,_6> *)&stack0xfffffffffffff980,alpha);
  DStack_13390.m_data = (double *)0x0;
  DStack_13390.m_rows = 0;
  DStack_13390.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&DStack_13390,0x9000,0x60,0x180);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dStack_13360;
  lVar79 = 0;
  lVar81 = 0;
  do {
    if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar91 < 0x40)) || (DStack_13390.m_rows <= lVar79)) ||
       (DStack_13390.m_cols < 0x40)) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    lVar87 = DStack_13390.m_cols * lVar79;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_12c00._0_64_);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_12c00._64_64_);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_12b80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x10) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_12b40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x18) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_12b00);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x20) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_12ac0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x28) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_12a80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x30) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_12a40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x38) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0x80)) || ((ulong)DStack_13390.m_cols < 0x80))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_12a00);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x40) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_129c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x48) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_12980);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x50) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_12940);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x58) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_12900);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x60) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_128c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x68) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_12880);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x70) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_12840);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x78) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_13390.m_cols < 0xc0))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_12800);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x80) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_127c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x88) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_12780);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x90) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_12740);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x98) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_12700);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xa0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_126c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xa8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_12680);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xb0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_12640);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xb8) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_13390.m_cols < 0x100))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_12a00);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_12800);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xc0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_129c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_127c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 200) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_12980);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_12780);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xd0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_12940);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_12740);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xd8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_12900);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_12700);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xe0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_128c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_126c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xe8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_12880);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_12680);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xf0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_12840);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_12640);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xf8) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_13390.m_cols < 0x140))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_12c00._0_64_);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_12800);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x100) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_12c00._64_64_);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_127c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x108) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_12b80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_12780);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x110) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_12b40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_12740);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x118) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_12b00);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_12700);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x120) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_12ac0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_126c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x128) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_12a80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_12680);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x130) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_12a40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_12640);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x138) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0x80)) || ((ulong)DStack_13390.m_cols < 0x180))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_12c00._0_64_);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_12a00);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x140) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_12c00._64_64_);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_129c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x148) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_12b80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_12980);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x150) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_12b40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_12940);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x158) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_12b00);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_12900);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x160) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_12ac0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_128c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x168) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_12a80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_12880);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x170) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_12a40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_12840);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x178) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0x40)) || ((ulong)DStack_13390.m_rows <= lVar79 + 1U))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    lVar87 = (lVar79 + 1U) * DStack_13390.m_cols;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_12600);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_125c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_12580);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x10) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_12540);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x18) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_12500);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x20) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_124c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x28) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_12480);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x30) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_12440);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x38) = auVar99;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar81) ||
       (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar91 < 0x80)) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_12400);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x40) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_123c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x48) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_12380);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x50) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_12340);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x58) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_12300);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x60) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_122c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x68) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_12280);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x70) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_12240);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x78) = auVar99;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar81) ||
       (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar91 < 0xc0)) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_12200);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x80) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_121c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x88) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_12180);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x90) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_12140);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x98) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_12100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xa0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_120c0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xa8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_12080);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xb0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_12040);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xb8) = auVar99;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar81) ||
       (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar91 < 0xc0)) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_12400);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_12200);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xc0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_123c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_121c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 200) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_12380);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_12180);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xd0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_12340);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_12140);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xd8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_12300);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_12100);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xe0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_122c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_120c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xe8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_12280);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_12080);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xf0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_12240);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_12040);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xf8) = auVar99;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar81) ||
       (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar91 < 0xc0)) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_12600);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_12200);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x100) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_125c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_121c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x108) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_12580);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_12180);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x110) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_12540);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_12140);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x118) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_12500);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_12100);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x120) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_124c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_120c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x128) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_12480);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_12080);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x130) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_12440);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_12040);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x138) = auVar99;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar81) ||
       (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar91 < 0x80)) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_12600);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_12400);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x140) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_125c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_123c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x148) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_12580);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_12380);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x150) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_12540);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_12340);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x158) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_12500);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_12300);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x160) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_124c0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_122c0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x168) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_12480);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_12280);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x170) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_12440);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_12240);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x178) = auVar99;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar81) ||
       ((lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0x40 ||
        (uVar85 = lVar79 + 2, (ulong)DStack_13390.m_rows <= uVar85)))) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    lVar87 = DStack_13390.m_cols * uVar85;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_12000);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_11fc0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_11f80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x10) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_11f40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x18) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_11f00);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x20) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_11ec0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x28) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_11e80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x30) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_11e40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x38) = auVar99;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar81) ||
       (((lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar91 < 0x80 || (DStack_13390.m_rows <= (long)uVar85)) ||
        (DStack_13390.m_cols < 0x80)))) goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    lVar87 = uVar85 * DStack_13390.m_cols;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_11e00);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x40) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_11dc0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x48) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_11d80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x50) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_11d40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x58) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_11d00);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x60) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_11cc0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x68) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_11c80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x70) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_11c40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x78) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_13390.m_cols < 0xc0))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_11c00);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x80) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_11bc0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x88) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_11b80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x90) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_11b40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x98) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_11b00);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xa0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_11ac0);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xa8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_11a80);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xb0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_11a40);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xb8) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_13390.m_cols < 0x100))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_11e00);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_11c00);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xc0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_11dc0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_11bc0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 200) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_11d80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_11b80);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xd0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_11d40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_11b40);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xd8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_11d00);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_11b00);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xe0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_11cc0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_11ac0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xe8) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_11c80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_11a80);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xf0) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_11c40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_11a40);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0xf8) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_13390.m_cols < 0x140))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x80),auStack_12000);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_11c00);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x100) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x88),auStack_11fc0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_11bc0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x108) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x90),auStack_11f80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_11b80);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x110) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x98),auStack_11f40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_11b40);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x118) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa0),auStack_11f00);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_11b00);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x120) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xa8),auStack_11ec0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_11ac0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x128) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb0),auStack_11e80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_11a80);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x130) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0xb8),auStack_11e40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_11a40);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x138) = auVar99;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar81) ||
        (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar91 < 0x80)) || ((ulong)DStack_13390.m_cols < 0x180))
    goto LAB_006f2b62;
    pdVar96 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar91 = lVar91 * lVar81;
    lVar81 = lVar81 + 1;
    lVar79 = lVar79 + 3;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x40),auStack_12000);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91),auStack_11e00);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x140) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x48),auStack_11fc0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 8),auStack_11dc0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x148) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x50),auStack_11f80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x10),auStack_11d80);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x150) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x58),auStack_11f40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x18),auStack_11d40);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x158) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x60),auStack_11f00);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x20),auStack_11d00);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x160) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x68),auStack_11ec0);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x28),auStack_11cc0);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x168) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x70),auStack_11e80);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x30),auStack_11c80);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x170) = auVar99;
    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x78),auStack_11e40);
    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar96 + lVar91 + 0x38),auStack_11c40);
    auVar99 = vaddpd_avx512f(auVar99,auVar100);
    *(undefined1 (*) [64])(DStack_13390.m_data + lVar87 + 0x178) = auVar99;
  } while (lVar81 != 0x20);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = this->m_Alpha;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = auStack_13140._0_8_;
  pDVar80 = (DenseStorage<double,__1,__1,__1,_1> *)auStack_11a00;
  lVar79 = 0;
  auVar126 = vfmadd213sd_fma(auVar125,auVar124,auVar126);
  local_d700._0_8_ = this->m_Alpha * dStack_13360;
  local_d700._8_8_ = pDVar80;
  local_c680.m_matrix = auVar126._0_8_;
  pMStack_c678 = (Matrix<double,_192,_6,_0,_192,_6> *)pdVar95;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d700._0_8_;
  auVar99 = vbroadcastsd_avx512f(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar126._0_8_;
  auVar100 = vbroadcastsd_avx512f(auVar5);
  do {
    uVar85 = 0xfffffffffffffff8;
    do {
      auVar101 = vmulpd_avx512f(auVar100,*(undefined1 (*) [64])(pdVar95 + uVar85 + 8));
      auVar102 = vmulpd_avx512f(auVar99,*(undefined1 (*) [64])(&pDVar80[2].m_cols + uVar85));
      auVar101 = vaddpd_avx512f(auVar101,auVar102);
      *(undefined1 (*) [64])(alpha + uVar85 + 8) = auVar101;
      uVar85 = uVar85 + 8;
    } while (uVar85 < 0xb8);
    lVar79 = lVar79 + 1;
    pDVar80 = pDVar80 + 0x40;
    pdVar95 = pdVar95 + 0xc0;
    alpha = alpha + 0xc0;
  } while (lVar79 != 3);
  if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows == 0x40) &&
     ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols == 1)) {
    pauVar88 = (undefined1 (*) [64])
               (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
    lVar79 = 0x5c0;
    do {
      auVar99 = vmulpd_avx512f(*pauVar88,*(undefined1 (*) [64])(auStack_10dc0 + lVar79));
      *(undefined1 (*) [64])(auStack_10dc0 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[1],*(undefined1 (*) [64])(auStack_10d80 + lVar79));
      *(undefined1 (*) [64])(auStack_10d80 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[2],*(undefined1 (*) [64])(auStack_10d40 + lVar79));
      *(undefined1 (*) [64])(auStack_10d40 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[3],*(undefined1 (*) [64])(auStack_10d00 + lVar79));
      *(undefined1 (*) [64])(auStack_10d00 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[4],*(undefined1 (*) [64])(auStack_10cc0 + lVar79));
      *(undefined1 (*) [64])(auStack_10cc0 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[5],*(undefined1 (*) [64])(auStack_10c80 + lVar79));
      *(undefined1 (*) [64])(auStack_10c80 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[6],*(undefined1 (*) [64])(auStack_10c40 + lVar79));
      *(undefined1 (*) [64])(auStack_10c40 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[7],*(undefined1 (*) [64])(auStack_10c00 + lVar79));
      *(undefined1 (*) [64])(auStack_10c00 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(*pauVar88,*(undefined1 (*) [64])(auStack_10bc0 + lVar79));
      *(undefined1 (*) [64])(auStack_10bc0 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[1],*(undefined1 (*) [64])(auStack_10b80 + lVar79));
      *(undefined1 (*) [64])(auStack_10b80 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[2],*(undefined1 (*) [64])(auStack_10b40 + lVar79));
      *(undefined1 (*) [64])(auStack_10b40 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[3],*(undefined1 (*) [64])(auStack_10b00 + lVar79));
      *(undefined1 (*) [64])(auStack_10b00 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[4],*(undefined1 (*) [64])(auStack_10ac0 + lVar79));
      *(undefined1 (*) [64])(auStack_10ac0 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[5],*(undefined1 (*) [64])(auStack_10a80 + lVar79));
      *(undefined1 (*) [64])(auStack_10a80 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[6],*(undefined1 (*) [64])(auStack_10a40 + lVar79));
      *(undefined1 (*) [64])(auStack_10a40 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[7],*(undefined1 (*) [64])(auStack_10a00 + lVar79));
      *(undefined1 (*) [64])(auStack_10a00 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(*pauVar88,*(undefined1 (*) [64])(auStack_109c0 + lVar79));
      *(undefined1 (*) [64])(auStack_109c0 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[1],*(undefined1 (*) [64])(auStack_10980 + lVar79));
      *(undefined1 (*) [64])(auStack_10980 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[2],*(undefined1 (*) [64])(auStack_10940 + lVar79));
      *(undefined1 (*) [64])(auStack_10940 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[3],*(undefined1 (*) [64])(auStack_10900 + lVar79));
      *(undefined1 (*) [64])(auStack_10900 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[4],*(undefined1 (*) [64])(auStack_108c0 + lVar79));
      *(undefined1 (*) [64])(auStack_108c0 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[5],*(undefined1 (*) [64])(auStack_10880 + lVar79));
      *(undefined1 (*) [64])(auStack_10880 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[6],*(undefined1 (*) [64])(auStack_10840 + lVar79));
      *(undefined1 (*) [64])(auStack_10840 + lVar79) = auVar99;
      auVar99 = vmulpd_avx512f(pauVar88[7],*(undefined1 (*) [64])(auStack_107f8 + lVar79 + -8));
      *(undefined1 (*) [64])(auStack_107f8 + lVar79 + -8) = auVar99;
      lVar79 = lVar79 + 0x600;
    } while (lVar79 != 0x17c0);
    DStack_133e0.m_data = (double *)0x0;
    DStack_133e0.m_rows = 0;
    DStack_133e0.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&DStack_133e0,0x9000,0x60,0x180);
    lVar79 = 0;
    lVar81 = 0;
    do {
      if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar81) ||
           (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar91 < 0x40)) || (DStack_133e0.m_rows <= lVar79)) ||
         (DStack_133e0.m_cols < 0x40)) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      lVar87 = DStack_133e0.m_cols * lVar79;
      auVar99._8_56_ = auStack_107f8;
      auVar99._0_8_ = SStack_10800;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),auVar99);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),auStack_107c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),auStack_10780);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x10) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),auStack_10740);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x18) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),auStack_10700);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x20) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),auStack_106c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x28) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),auStack_10680);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x30) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),auStack_10640);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x38) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0x80)) || ((ulong)DStack_133e0.m_cols < 0x80))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),auStack_10600);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x40) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),auStack_105c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x48) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),auStack_10580);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x50) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),auStack_10540);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x58) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),auStack_10500);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x60) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),auStack_104c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x68) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),auStack_10480);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x70) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),auStack_10440);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x78) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_133e0.m_cols < 0xc0))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),auStack_10400);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x80) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),auStack_103c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x88) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),auStack_10380);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x90) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),auStack_10340);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x98) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),auStack_10300);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xa0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),auStack_102c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xa8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),auStack_10280);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xb0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),auStack_10240);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xb8) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_133e0.m_cols < 0x100))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),auStack_10600);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),auStack_10400);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xc0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),auStack_105c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),auStack_103c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 200) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),auStack_10580);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),auStack_10380);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xd0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),auStack_10540);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),auStack_10340);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xd8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),auStack_10500);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),auStack_10300);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xe0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),auStack_104c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),auStack_102c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xe8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),auStack_10480);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),auStack_10280);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xf0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),auStack_10440);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),auStack_10240);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xf8) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_133e0.m_cols < 0x140))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar100._8_56_ = auStack_107f8;
      auVar100._0_8_ = SStack_10800;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),auVar100);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),auStack_10400);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x100) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),auStack_107c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),auStack_103c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x108) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),auStack_10780);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),auStack_10380);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x110) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),auStack_10740);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),auStack_10340);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x118) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),auStack_10700);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),auStack_10300);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x120) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),auStack_106c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),auStack_102c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x128) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),auStack_10680);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),auStack_10280);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x130) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),auStack_10640);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),auStack_10240);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x138) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0x80)) || ((ulong)DStack_133e0.m_cols < 0x180))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar101._8_56_ = auStack_107f8;
      auVar101._0_8_ = SStack_10800;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),auVar101);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),auStack_10600);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x140) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),auStack_107c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),auStack_105c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x148) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),auStack_10780);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),auStack_10580);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x150) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),auStack_10740);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),auStack_10540);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x158) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),auStack_10700);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),auStack_10500);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x160) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),auStack_106c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),auStack_104c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x168) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),auStack_10680);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),auStack_10480);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x170) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),auStack_10640);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),auStack_10440);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x178) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0x40)) || ((ulong)DStack_133e0.m_rows <= lVar79 + 1U)
         ) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      lVar87 = (lVar79 + 1U) * DStack_133e0.m_cols;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),auStack_10200);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),auStack_101c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),auStack_10180);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x10) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),auStack_10140);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x18) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),auStack_10100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x20) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),auStack_100c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x28) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),auStack_10080);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x30) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),auStack_10040);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x38) = auVar99;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar91 < 0x80)) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),local_10000);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x40) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),local_ffc0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x48) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),local_ff80);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x50) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),local_ff40);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x58) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),local_ff00);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x60) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),local_fec0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x68) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),local_fe80);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x70) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),local_fe40);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x78) = auVar99;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar91 < 0xc0)) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),local_fe00);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x80) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),local_fdc0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x88) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),local_fd80);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x90) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),local_fd40);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x98) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),local_fd00);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xa0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),local_fcc0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xa8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),local_fc80);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xb0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),local_fc40);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xb8) = auVar99;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar91 < 0xc0)) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),local_10000);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),local_fe00);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xc0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),local_ffc0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),local_fdc0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 200) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),local_ff80);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),local_fd80);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xd0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),local_ff40);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),local_fd40);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xd8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),local_ff00);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),local_fd00);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xe0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),local_fec0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),local_fcc0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xe8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),local_fe80);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),local_fc80);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xf0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),local_fe40);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),local_fc40);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xf8) = auVar99;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar91 < 0xc0)) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),auStack_10200);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),local_fe00);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x100) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),auStack_101c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),local_fdc0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x108) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),auStack_10180);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),local_fd80);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x110) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),auStack_10140);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),local_fd40);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x118) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),auStack_10100);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),local_fd00);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x120) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),auStack_100c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),local_fcc0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x128) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),auStack_10080);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),local_fc80);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x130) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),auStack_10040);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),local_fc40);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x138) = auVar99;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar91 < 0x80)) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),auStack_10200);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),local_10000);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x140) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),auStack_101c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),local_ffc0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x148) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),auStack_10180);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),local_ff80);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x150) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),auStack_10140);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),local_ff40);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x158) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),auStack_10100);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),local_ff00);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x160) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),auStack_100c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),local_fec0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x168) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),auStack_10080);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),local_fe80);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x170) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),auStack_10040);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),local_fe40);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x178) = auVar99;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         ((lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0x40 ||
          (uVar85 = lVar79 + 2, (ulong)DStack_133e0.m_rows <= uVar85)))) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      lVar87 = DStack_133e0.m_cols * uVar85;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),local_fc00);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),local_fbc0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),local_fb80);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x10) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),local_fb40);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x18) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),local_fb00);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x20) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),local_fac0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x28) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),local_fa80);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x30) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),local_fa40);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x38) = auVar99;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar81) ||
         (((lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar91 < 0x80 || (DStack_133e0.m_rows <= (long)uVar85)) ||
          (DStack_133e0.m_cols < 0x80)))) goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      lVar87 = uVar85 * DStack_133e0.m_cols;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),local_fa00);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x40) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),local_f9c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x48) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),local_f980);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x50) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),local_f940);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x58) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),local_f900);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x60) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),local_f8c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x68) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),local_f880);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x70) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),local_f840);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x78) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_133e0.m_cols < 0xc0))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),local_f800);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x80) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),local_f7c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x88) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),local_f780);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x90) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),local_f740);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x98) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),local_f700);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xa0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),local_f6c0);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xa8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),local_f680);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xb0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),local_f640);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xb8) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_133e0.m_cols < 0x100))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),local_fa00);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),local_f800);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xc0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),local_f9c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),local_f7c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 200) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),local_f980);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),local_f780);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xd0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),local_f940);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),local_f740);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xd8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),local_f900);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),local_f700);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xe0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),local_f8c0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),local_f6c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xe8) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),local_f880);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),local_f680);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xf0) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),local_f840);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),local_f640);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0xf8) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0xc0)) || ((ulong)DStack_133e0.m_cols < 0x140))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x80),local_fc00);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),local_f800);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x100) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x88),local_fbc0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),local_f7c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x108) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x90),local_fb80);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),local_f780);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x110) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x98),local_fb40);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),local_f740);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x118) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa0),local_fb00);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),local_f700);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x120) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xa8),local_fac0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),local_f6c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x128) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb0),local_fa80);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),local_f680);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x130) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0xb8),local_fa40);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),local_f640);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x138) = auVar99;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar81) ||
          (lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar91 < 0x80)) || ((ulong)DStack_133e0.m_cols < 0x180))
      goto LAB_006f2b62;
      pdVar95 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar91 = lVar91 * lVar81;
      lVar81 = lVar81 + 1;
      lVar79 = lVar79 + 3;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x40),local_fc00);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91),local_fa00);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x140) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x48),local_fbc0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 8),local_f9c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x148) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x50),local_fb80);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x10),local_f980);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x150) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x58),local_fb40);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x18),local_f940);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x158) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x60),local_fb00);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x20),local_f900);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x160) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x68),local_fac0);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x28),local_f8c0);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x168) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x70),local_fa80);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x30),local_f880);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x170) = auVar99;
      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x78),local_fa40);
      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar95 + lVar91 + 0x38),local_f840);
      auVar99 = vaddpd_avx512f(auVar99,auVar100);
      *(undefined1 (*) [64])(DStack_133e0.m_data + lVar87 + 0x178) = auVar99;
    } while (lVar81 != 0x20);
    peVar50 = (this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    this_00 = (this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    DStack_133c0.m_data = (double *)0x0;
    DStack_133c0.m_rows = 0;
    DStack_133c0.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&DStack_133c0,0x9000,0x60,0x180);
    auVar100 = auStack_13000;
    auVar99 = auStack_13340._0_64_;
    if (((0x5f < DStack_133e0.m_rows) && (0x3f < DStack_133e0.m_cols)) &&
       ((0x7f < (ulong)DStack_133e0.m_cols &&
        ((((0xbf < (ulong)DStack_133e0.m_cols && (0xff < (ulong)DStack_133e0.m_cols)) &&
          (0x13f < (ulong)DStack_133e0.m_cols)) && (0x17f < (ulong)DStack_133e0.m_cols)))))) {
      local_d700._0_8_ = DStack_133c0.m_data;
      local_d6e8.m_value = 0;
      vStack_d6e0.m_value = 0;
      local_d6d8 = DStack_133c0.m_cols;
      local_d6f0 = &DStack_133c0;
      if ((0x5f < DStack_133c0.m_rows) && (0x3f < DStack_133c0.m_cols)) {
        local_c640[0] = DStack_133e0.m_data;
        pdStack_c610 = DStack_133e0.m_data + 0x40;
        pdStack_c5e0 = DStack_133e0.m_data + 0x80;
        pdStack_c5b0 = DStack_133e0.m_data + 0xc0;
        local_c580 = DStack_133e0.m_data + 0x100;
        pdStack_c550 = DStack_133e0.m_data + 0x140;
        uStack_c630 = DStack_133e0.m_cols;
        auStack_13000._0_8_ = DStack_133c0.m_data;
        auVar101 = auStack_13000;
        local_c600 = DStack_133e0.m_cols;
        uStack_c5d0 = DStack_133e0.m_cols;
        uStack_c5a0 = DStack_133e0.m_cols;
        uStack_c570 = DStack_133e0.m_cols;
        local_c540 = DStack_133e0.m_cols;
        auStack_13000._24_40_ = auVar100._24_40_;
        auStack_13000._0_16_ = auVar101._0_16_;
        auStack_13000._16_8_ = DStack_133c0.m_cols;
        auStack_13340._8_8_ = &local_c680;
        auStack_13340._0_8_ = (Matrix<double,_192,_6,_0,_192,_6> *)auStack_13000;
        auStack_13340._16_8_ = (DenseStorage<double,__1,__1,__1,_1> *)local_f000;
        auStack_13340._32_32_ = auVar99._32_32_;
        auStack_13340._24_8_ = (DstXprType *)local_d700;
        dStack_c650 = (peVar50->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array[0];
        dStack_c620 = *(double *)
                       ((long)(peVar50->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 8);
        dStack_c5f0 = *(double *)
                       ((long)(peVar50->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 0x10);
        local_c5c0[0] =
             *(double *)
              ((long)(peVar50->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18);
        dStack_c590 = *(double *)
                       ((long)(peVar50->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 0x20);
        dStack_c560 = *(double *)
                       ((long)(peVar50->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 0x28);
        Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                  ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_13340);
        auVar100 = auStack_13000;
        auVar99 = auStack_13340._0_64_;
        if ((0x5f < DStack_133e0.m_rows) &&
           (((0x3f < DStack_133e0.m_cols && (0x7f < (ulong)DStack_133e0.m_cols)) &&
            ((0xbf < (ulong)DStack_133e0.m_cols &&
             (((0xff < (ulong)DStack_133e0.m_cols && (0x13f < (ulong)DStack_133e0.m_cols)) &&
              (0x17f < (ulong)DStack_133e0.m_cols)))))))) {
          local_d700._0_8_ =
               &((DenseStorage<double,__1,__1,__1,_1> *)((long)DStack_133c0.m_data + 0x1f8))->m_rows
          ;
          local_d6e8.m_value = 0;
          vStack_d6e0.m_value = 0x40;
          local_d6d8 = DStack_133c0.m_cols;
          local_d6f0 = &DStack_133c0;
          if ((0x5f < DStack_133c0.m_rows) && (0x7f < DStack_133c0.m_cols)) {
            local_c640[0] = DStack_133e0.m_data;
            pdStack_c610 = DStack_133e0.m_data + 0x40;
            pdStack_c5e0 = DStack_133e0.m_data + 0x80;
            pdStack_c5b0 = DStack_133e0.m_data + 0xc0;
            local_c580 = DStack_133e0.m_data + 0x100;
            pdStack_c550 = DStack_133e0.m_data + 0x140;
            auStack_13000._0_8_ = local_d700._0_8_;
            auVar101 = auStack_13000;
            uStack_c630 = DStack_133e0.m_cols;
            auStack_13000._24_40_ = auVar100._24_40_;
            auStack_13000._0_16_ = auVar101._0_16_;
            auStack_13000._16_8_ = DStack_133c0.m_cols;
            local_c600 = DStack_133e0.m_cols;
            uStack_c5d0 = DStack_133e0.m_cols;
            uStack_c5a0 = DStack_133e0.m_cols;
            uStack_c570 = DStack_133e0.m_cols;
            local_c540 = DStack_133e0.m_cols;
            auStack_13340._8_8_ = &local_c680;
            auStack_13340._32_32_ = auVar99._32_32_;
            auStack_13340._24_8_ = (DstXprType *)local_d700;
            dStack_c650 = *(double *)
                           ((long)(peVar50->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array + 0x30);
            dStack_c620 = *(double *)
                           ((long)(peVar50->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array + 0x38);
            dStack_c5f0 = *(double *)
                           ((long)(peVar50->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array + 0x40);
            local_c5c0[0] =
                 *(double *)
                  ((long)(peVar50->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                         .m_storage.m_data.array + 0x48);
            dStack_c590 = *(double *)
                           ((long)(peVar50->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array + 0x50);
            dStack_c560 = *(double *)
                           ((long)(peVar50->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array + 0x58);
            Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                      ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_13340);
            auVar100 = auStack_13000;
            auVar99 = auStack_13340._0_64_;
            if ((0x5f < DStack_133e0.m_rows) &&
               (((0x3f < DStack_133e0.m_cols && (0x7f < (ulong)DStack_133e0.m_cols)) &&
                ((0xbf < (ulong)DStack_133e0.m_cols &&
                 (((0xff < (ulong)DStack_133e0.m_cols && (0x13f < (ulong)DStack_133e0.m_cols)) &&
                  (0x17f < (ulong)DStack_133e0.m_cols)))))))) {
              local_d700._0_8_ =
                   &((DenseStorage<double,__1,__1,__1,_1> *)((long)DStack_133c0.m_data + 0x3f0))->
                    m_cols;
              local_d6e8.m_value = 0;
              vStack_d6e0.m_value = 0x80;
              local_d6d8 = DStack_133c0.m_cols;
              local_d6f0 = &DStack_133c0;
              if ((0x5f < DStack_133c0.m_rows) && (0xbf < DStack_133c0.m_cols)) {
                local_c640[0] = DStack_133e0.m_data;
                pdStack_c610 = DStack_133e0.m_data + 0x40;
                pdStack_c5e0 = DStack_133e0.m_data + 0x80;
                pdStack_c5b0 = DStack_133e0.m_data + 0xc0;
                local_c580 = DStack_133e0.m_data + 0x100;
                pdStack_c550 = DStack_133e0.m_data + 0x140;
                auStack_13000._0_8_ = local_d700._0_8_;
                auVar101 = auStack_13000;
                uStack_c630 = DStack_133e0.m_cols;
                auStack_13000._24_40_ = auVar100._24_40_;
                auStack_13000._0_16_ = auVar101._0_16_;
                auStack_13000._16_8_ = DStack_133c0.m_cols;
                local_c600 = DStack_133e0.m_cols;
                uStack_c5d0 = DStack_133e0.m_cols;
                uStack_c5a0 = DStack_133e0.m_cols;
                uStack_c570 = DStack_133e0.m_cols;
                local_c540 = DStack_133e0.m_cols;
                auStack_13340._8_8_ = &local_c680;
                auStack_13340._32_32_ = auVar99._32_32_;
                auStack_13340._24_8_ = (DstXprType *)local_d700;
                dStack_c650 = *(double *)
                               ((long)(peVar50->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array + 0x60);
                dStack_c620 = *(double *)
                               ((long)(peVar50->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array + 0x68);
                dStack_c5f0 = *(double *)
                               ((long)(peVar50->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array + 0x70);
                local_c5c0[0] =
                     *(double *)
                      ((long)(peVar50->m_D).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                             m_data.array + 0x78);
                dStack_c590 = *(double *)
                               ((long)(peVar50->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array + 0x80);
                dStack_c560 = *(double *)
                               ((long)(peVar50->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array + 0x88);
                Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                          ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_13340);
                auVar100 = auStack_13000;
                auVar99 = auStack_13340._0_64_;
                if ((0x5f < DStack_133e0.m_rows) &&
                   (((0x3f < DStack_133e0.m_cols && (0x7f < (ulong)DStack_133e0.m_cols)) &&
                    ((0xbf < (ulong)DStack_133e0.m_cols &&
                     (((0xff < (ulong)DStack_133e0.m_cols && (0x13f < (ulong)DStack_133e0.m_cols))
                      && (0x17f < (ulong)DStack_133e0.m_cols)))))))) {
                  local_d700._0_8_ = (long)DStack_133c0.m_data + 0x600;
                  local_d6e8.m_value = 0;
                  vStack_d6e0.m_value = 0xc0;
                  local_d6d8 = DStack_133c0.m_cols;
                  local_d6f0 = &DStack_133c0;
                  if ((0x5f < DStack_133c0.m_rows) && (0xff < DStack_133c0.m_cols)) {
                    local_c640[0] = DStack_133e0.m_data;
                    pdStack_c610 = DStack_133e0.m_data + 0x40;
                    pdStack_c5e0 = DStack_133e0.m_data + 0x80;
                    pdStack_c5b0 = DStack_133e0.m_data + 0xc0;
                    local_c580 = DStack_133e0.m_data + 0x100;
                    pdStack_c550 = DStack_133e0.m_data + 0x140;
                    auStack_13000._0_8_ = local_d700._0_8_;
                    auVar101 = auStack_13000;
                    uStack_c630 = DStack_133e0.m_cols;
                    auStack_13000._24_40_ = auVar100._24_40_;
                    auStack_13000._0_16_ = auVar101._0_16_;
                    auStack_13000._16_8_ = DStack_133c0.m_cols;
                    local_c600 = DStack_133e0.m_cols;
                    uStack_c5d0 = DStack_133e0.m_cols;
                    uStack_c5a0 = DStack_133e0.m_cols;
                    uStack_c570 = DStack_133e0.m_cols;
                    local_c540 = DStack_133e0.m_cols;
                    auStack_13340._8_8_ = &local_c680;
                    auStack_13340._32_32_ = auVar99._32_32_;
                    auStack_13340._24_8_ = (DstXprType *)local_d700;
                    dStack_c650 = *(double *)
                                   ((long)(peVar50->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array + 0x90);
                    dStack_c620 = *(double *)
                                   ((long)(peVar50->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array + 0x98);
                    dStack_c5f0 = *(double *)
                                   ((long)(peVar50->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array + 0xa0);
                    local_c5c0[0] =
                         *(double *)
                          ((long)(peVar50->m_D).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                 m_storage.m_data.array + 0xa8);
                    dStack_c590 = *(double *)
                                   ((long)(peVar50->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array + 0xb0);
                    dStack_c560 = *(double *)
                                   ((long)(peVar50->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array + 0xb8);
                    Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                              ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_13340);
                    auVar100 = auStack_13000;
                    auVar99 = auStack_13340._0_64_;
                    if ((0x5f < DStack_133e0.m_rows) &&
                       (((0x3f < DStack_133e0.m_cols && (0x7f < (ulong)DStack_133e0.m_cols)) &&
                        ((0xbf < (ulong)DStack_133e0.m_cols &&
                         (((0xff < (ulong)DStack_133e0.m_cols &&
                           (0x13f < (ulong)DStack_133e0.m_cols)) &&
                          (0x17f < (ulong)DStack_133e0.m_cols)))))))) {
                      local_d700._0_8_ =
                           &((DenseStorage<double,__1,__1,__1,_1> *)
                            ((long)DStack_133c0.m_data + 0x7f8))->m_rows;
                      local_d6e8.m_value = 0;
                      vStack_d6e0.m_value = 0x100;
                      local_d6d8 = DStack_133c0.m_cols;
                      local_d6f0 = &DStack_133c0;
                      if ((0x5f < DStack_133c0.m_rows) && (0x13f < DStack_133c0.m_cols)) {
                        local_c640[0] = DStack_133e0.m_data;
                        pdStack_c610 = DStack_133e0.m_data + 0x40;
                        pdStack_c5e0 = DStack_133e0.m_data + 0x80;
                        pdStack_c5b0 = DStack_133e0.m_data + 0xc0;
                        local_c580 = DStack_133e0.m_data + 0x100;
                        pdStack_c550 = DStack_133e0.m_data + 0x140;
                        auStack_13000._0_8_ = local_d700._0_8_;
                        auVar101 = auStack_13000;
                        uStack_c630 = DStack_133e0.m_cols;
                        auStack_13000._24_40_ = auVar100._24_40_;
                        auStack_13000._0_16_ = auVar101._0_16_;
                        auStack_13000._16_8_ = DStack_133c0.m_cols;
                        local_c600 = DStack_133e0.m_cols;
                        uStack_c5d0 = DStack_133e0.m_cols;
                        uStack_c5a0 = DStack_133e0.m_cols;
                        uStack_c570 = DStack_133e0.m_cols;
                        local_c540 = DStack_133e0.m_cols;
                        auStack_13340._8_8_ = &local_c680;
                        auStack_13340._32_32_ = auVar99._32_32_;
                        auStack_13340._24_8_ = (DstXprType *)local_d700;
                        dStack_c650 = *(double *)
                                       ((long)(peVar50->m_D).
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                              .m_storage.m_data.array + 0xc0);
                        dStack_c620 = *(double *)
                                       ((long)(peVar50->m_D).
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                              .m_storage.m_data.array + 200);
                        dStack_c5f0 = *(double *)
                                       ((long)(peVar50->m_D).
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                              .m_storage.m_data.array + 0xd0);
                        local_c5c0[0] =
                             *(double *)
                              ((long)(peVar50->m_D).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                     m_storage.m_data.array + 0xd8);
                        dStack_c590 = *(double *)
                                       ((long)(peVar50->m_D).
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                              .m_storage.m_data.array + 0xe0);
                        dStack_c560 = *(double *)
                                       ((long)(peVar50->m_D).
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                              .m_storage.m_data.array + 0xe8);
                        Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                                  ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_13340);
                        auVar100 = auStack_13000;
                        auVar99 = auStack_13340._0_64_;
                        if ((0x5f < DStack_133e0.m_rows) &&
                           (((0x3f < DStack_133e0.m_cols && (0x7f < (ulong)DStack_133e0.m_cols)) &&
                            ((0xbf < (ulong)DStack_133e0.m_cols &&
                             (((0xff < (ulong)DStack_133e0.m_cols &&
                               (0x13f < (ulong)DStack_133e0.m_cols)) &&
                              (0x17f < (ulong)DStack_133e0.m_cols)))))))) {
                          local_d700._0_8_ =
                               &((DenseStorage<double,__1,__1,__1,_1> *)
                                ((long)DStack_133c0.m_data + 0x9f0))->m_cols;
                          local_d6e8.m_value = 0;
                          vStack_d6e0.m_value = 0x140;
                          local_d6d8 = DStack_133c0.m_cols;
                          local_d6f0 = &DStack_133c0;
                          if ((0x5f < DStack_133c0.m_rows) && (0x17f < DStack_133c0.m_cols)) {
                            local_c640[0] = DStack_133e0.m_data;
                            pdStack_c610 = DStack_133e0.m_data + 0x40;
                            pdStack_c5e0 = DStack_133e0.m_data + 0x80;
                            pdStack_c5b0 = DStack_133e0.m_data + 0xc0;
                            local_c580 = DStack_133e0.m_data + 0x100;
                            pdStack_c550 = DStack_133e0.m_data + 0x140;
                            auStack_13000._0_8_ = local_d700._0_8_;
                            auVar101 = auStack_13000;
                            uStack_c630 = DStack_133e0.m_cols;
                            auStack_13000._24_40_ = auVar100._24_40_;
                            auStack_13000._0_16_ = auVar101._0_16_;
                            auStack_13000._16_8_ = DStack_133c0.m_cols;
                            local_c600 = DStack_133e0.m_cols;
                            uStack_c5d0 = DStack_133e0.m_cols;
                            uStack_c5a0 = DStack_133e0.m_cols;
                            uStack_c570 = DStack_133e0.m_cols;
                            local_c540 = DStack_133e0.m_cols;
                            auStack_13340._8_8_ = &local_c680;
                            auStack_13340._32_32_ = auVar99._32_32_;
                            auStack_13340._24_8_ = (DstXprType *)local_d700;
                            dStack_c650 = *(double *)
                                           ((long)(peVar50->m_D).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xf0);
                            dStack_c620 = *(double *)
                                           ((long)(peVar50->m_D).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xf8);
                            dStack_c5f0 = *(double *)
                                           ((long)(peVar50->m_D).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x100);
                            local_c5c0[0] =
                                 *(double *)
                                  ((long)(peVar50->m_D).
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                         .m_storage.m_data.array + 0x108);
                            dStack_c590 = *(double *)
                                           ((long)(peVar50->m_D).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x110);
                            dStack_c560 = *(double *)
                                           ((long)(peVar50->m_D).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x118);
                            Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                                      ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_13340)
                            ;
                            if (DStack_13390.m_cols != DStack_133c0.m_cols) {
                              pcVar83 = 
                              "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                              ;
                              goto LAB_006f2b99;
                            }
                            local_d700._0_8_ = &DStack_13390;
                            local_d700._8_8_ = &DStack_133c0;
                            Eigen::Matrix<double,-1,-1,0,-1,-1>::
                            Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,0>>
                                      ((Matrix<double,_1,_1,0,_1,_1> *)&local_c680,
                                       (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>
                                        *)local_d700);
                            if (((Matrix<double,_192,_6,_0,_192,_6> *)
                                 (H->
                                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                 ).
                                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 .
                                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                 .m_rows.m_value != pMStack_c678) ||
                               ((H->
                                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                ).
                                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                .
                                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                .m_cols.m_value != lStack_c670)) {
                              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                                            "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>]"
                                           );
                            }
                            if (0 < (long)pMStack_c678) {
                              pMVar92 = (Matrix<double,_192,_6,_0,_192,_6> *)0x0;
                              pdVar86 = (H->
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                        ).
                                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                        .
                                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                        .m_data;
                              lVar79 = (H->
                                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                       ).m_stride.m_outer.m_value;
                              TVar94.m_matrix = local_c680.m_matrix;
                              do {
                                if (0 < lStack_c670) {
                                  lVar81 = 0;
                                  pMVar97 = TVar94.m_matrix;
                                  do {
                                    pPVar78 = &pMVar97->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    ;
                                    pMVar97 = (Matrix<double,__1,__1,_1,__1,__1> *)
                                              (&(pMVar97->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                ).m_storage.m_data + (long)pMStack_c678);
                                    pdVar86[lVar81] = (double)(pPVar78->m_storage).m_data;
                                    lVar81 = lVar81 + 1;
                                  } while (lStack_c670 != lVar81);
                                }
                                pMVar92 = (Matrix<double,_192,_6,_0,_192,_6> *)
                                          ((long)(pMVar92->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_192,_6,_0,_192,_6>_>
                                                 ).m_storage.m_data.array + 1);
                                TVar94.m_matrix =
                                     (non_const_type)
                                     &((TVar94.m_matrix)->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                      ).m_storage.m_rows;
                                pdVar86 = pdVar86 + lVar79;
                              } while (pMVar92 != pMStack_c678);
                            }
                            if (local_c680.m_matrix != (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
                              free(*(void **)((long)(local_c680.m_matrix + -1) + 0x10));
                            }
                            pMStack_c678 = (Matrix<double,_192,_6,_0,_192,_6> *)auStack_13340;
                            auVar99 = vmulpd_avx512f(auStack_12c00._0_64_,auStack_11a00);
                            auVar100 = vmulpd_avx512f(auStack_12600,auStack_11400);
                            auVar101 = vmulpd_avx512f(auStack_12b80,auStack_11980);
                            auVar102 = vmulpd_avx512f(auStack_11e80,auStack_10c80);
                            auVar103 = vmulpd_avx512f(auStack_12440,auStack_11240);
                            auVar104 = vmulpd_avx512f(auStack_11e40,auStack_10c40);
                            auVar105 = vmulpd_avx512f(auStack_12b80,auStack_12b80);
                            auVar106 = vmulpd_avx512f(auStack_12b40,auStack_12b40);
                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                            auVar100 = vmulpd_avx512f(auStack_12000,auStack_10e00);
                            auVar107 = vmulpd_avx512f(auStack_12480,auStack_11280);
                            auStack_13340._0_64_ = vaddpd_avx512f(auVar99,auVar100);
                            auVar99 = vmulpd_avx512f(auStack_12c00._64_64_,auStack_119c0);
                            auVar100 = vmulpd_avx512f(auStack_125c0,auStack_113c0);
                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                            auVar100 = vmulpd_avx512f(auStack_11fc0,auStack_10dc0);
                            auVar108 = vmulpd_avx512f(auStack_12540,auStack_11340);
                            auStack_13340._64_64_ = vaddpd_avx512f(auVar99,auVar100);
                            auVar99 = vmulpd_avx512f(auStack_12580,auStack_11380);
                            auVar99 = vaddpd_avx512f(auVar101,auVar99);
                            auVar100 = vmulpd_avx512f(auStack_11f80,auStack_10d80);
                            auStack_132c0 = vaddpd_avx512f(auVar99,auVar100);
                            auVar99 = vmulpd_avx512f(auStack_12b40,auStack_11940);
                            auVar99 = vaddpd_avx512f(auVar99,auVar108);
                            auVar100 = vmulpd_avx512f(auStack_11f40,auStack_10d40);
                            auStack_13280 = vaddpd_avx512f(auVar99,auVar100);
                            auVar99 = vmulpd_avx512f(auStack_12b00,auStack_11900);
                            auVar100 = vmulpd_avx512f(auStack_12500,auStack_11300);
                            auVar101 = vmulpd_avx512f(auStack_11ec0,auStack_10cc0);
                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                            auVar100 = vmulpd_avx512f(auStack_11f00,auStack_10d00);
                            auVar108 = vmulpd_avx512f(auStack_124c0,auStack_112c0);
                            auStack_13240 = vaddpd_avx512f(auVar99,auVar100);
                            auVar99 = vmulpd_avx512f(auStack_12ac0,auStack_118c0);
                            auVar100 = vmulpd_avx512f(auStack_12ac0,auStack_12ac0);
                            auVar109 = vmulpd_avx512f(auStack_124c0,auStack_124c0);
                            auVar100 = vaddpd_avx512f(auVar100,auVar109);
                            auVar109 = vmulpd_avx512f(auStack_11ec0,auStack_11ec0);
                            auVar100 = vaddpd_avx512f(auVar100,auVar109);
                            auVar109 = vmulpd_avx512f(auStack_12a80,auStack_12a80);
                            auVar99 = vaddpd_avx512f(auVar99,auVar108);
                            auVar108 = vmulpd_avx512f(auStack_12480,auStack_12480);
                            auStack_13200 = vaddpd_avx512f(auVar99,auVar101);
                            auVar99 = vmulpd_avx512f(auStack_12a80,auStack_11880);
                            auVar101 = vaddpd_avx512f(auVar109,auVar108);
                            auVar108 = vmulpd_avx512f(auStack_11e80,auStack_11e80);
                            auVar101 = vaddpd_avx512f(auVar101,auVar108);
                            auVar108 = vmulpd_avx512f(auStack_12a40,auStack_12a40);
                            auVar109 = vmulpd_avx512f(auStack_12440,auStack_12440);
                            auVar108 = vaddpd_avx512f(auVar108,auVar109);
                            auVar109 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
                            auVar99 = vaddpd_avx512f(auVar99,auVar107);
                            auStack_131c0 = vaddpd_avx512f(auVar99,auVar102);
                            auVar99 = vmulpd_avx512f(auStack_12a40,auStack_11840);
                            auVar101 = vaddpd_avx512f(auVar101,auVar109);
                            auVar102 = vmulpd_avx512f(auStack_11e40,auStack_11e40);
                            auVar102 = vaddpd_avx512f(auVar108,auVar102);
                            auVar102 = vaddpd_avx512f(auVar102,auVar109);
                            auVar99 = vaddpd_avx512f(auVar99,auVar103);
                            auVar100 = vaddpd_avx512f(auVar100,auVar109);
                            auVar103 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
                            auStack_13180 = vaddpd_avx512f(auVar99,auVar104);
                            auVar99 = vmulpd_avx512f(auStack_12c00._0_64_,auStack_12c00._0_64_);
                            auVar100 = vmulpd_avx512f(auVar100,auVar103);
                            auVar104 = vmulpd_avx512f(auStack_12c00._64_64_,auStack_12c00._64_64_);
                            auVar107 = vmulpd_avx512f(auStack_12600,auStack_12600);
                            auVar99 = vaddpd_avx512f(auVar99,auVar107);
                            auVar107 = vmulpd_avx512f(auStack_12000,auStack_12000);
                            auVar99 = vaddpd_avx512f(auVar99,auVar107);
                            auVar107 = vmulpd_avx512f(auStack_125c0,auStack_125c0);
                            auVar104 = vaddpd_avx512f(auVar104,auVar107);
                            auVar99 = vaddpd_avx512f(auVar99,auVar109);
                            auVar107 = vmulpd_avx512f(auStack_11fc0,auStack_11fc0);
                            auVar99 = vmulpd_avx512f(auVar99,auVar103);
                            auVar104 = vaddpd_avx512f(auVar104,auVar107);
                            auVar107 = vmulpd_avx512f(auStack_12580,auStack_12580);
                            auVar105 = vaddpd_avx512f(auVar105,auVar107);
                            auVar104 = vaddpd_avx512f(auVar104,auVar109);
                            auVar101 = vmulpd_avx512f(auVar101,auVar103);
                            auVar107 = vmulpd_avx512f(auStack_11f80,auStack_11f80);
                            auVar104 = vmulpd_avx512f(auVar104,auVar103);
                            auVar105 = vaddpd_avx512f(auVar105,auVar107);
                            auVar107 = vmulpd_avx512f(auStack_12540,auStack_12540);
                            auVar106 = vaddpd_avx512f(auVar106,auVar107);
                            auVar105 = vaddpd_avx512f(auVar105,auVar109);
                            auVar102 = vmulpd_avx512f(auVar102,auVar103);
                            auVar107 = vmulpd_avx512f(auStack_11f40,auStack_11f40);
                            auVar105 = vmulpd_avx512f(auVar105,auVar103);
                            auVar106 = vaddpd_avx512f(auVar106,auVar107);
                            auVar107 = vmulpd_avx512f(auStack_12b00,auStack_12b00);
                            auVar106 = vaddpd_avx512f(auVar106,auVar109);
                            auVar106 = vmulpd_avx512f(auVar106,auVar103);
                            auVar108 = vmulpd_avx512f(auStack_12500,auStack_12500);
                            auVar107 = vaddpd_avx512f(auVar107,auVar108);
                            auVar108 = vmulpd_avx512f(auStack_11f00,auStack_11f00);
                            auVar107 = vaddpd_avx512f(auVar107,auVar108);
                            auVar107 = vaddpd_avx512f(auVar107,auVar109);
                            auVar107 = vmulpd_avx512f(auVar107,auVar103);
                            local_c680.m_matrix = (non_const_type)this->m_Alpha;
                            auVar6._8_8_ = 0;
                            auVar6._0_8_ = local_c680.m_matrix;
                            auVar108 = vbroadcastsd_avx512f(auVar6);
                            auVar110 = vmulpd_avx512f(auVar108,auStack_13340._0_64_);
                            auStack_13000 = vaddpd_avx512f(auVar99,auVar110);
                            auVar99 = vmulpd_avx512f(auVar108,auStack_13340._64_64_);
                            auStack_12fc0 = vaddpd_avx512f(auVar104,auVar99);
                            auVar99 = vmulpd_avx512f(auVar108,auStack_132c0);
                            auStack_12f80 = vaddpd_avx512f(auVar105,auVar99);
                            auVar99 = vmulpd_avx512f(auVar108,auStack_13280);
                            auStack_12f40 = vaddpd_avx512f(auVar106,auVar99);
                            auVar99 = vmulpd_avx512f(auVar108,auStack_13240);
                            auStack_12f00 = vaddpd_avx512f(auVar107,auVar99);
                            auVar99 = vmulpd_avx512f(auVar108,auStack_13200);
                            auStack_12ec0 = vaddpd_avx512f(auVar100,auVar99);
                            auVar99 = vmulpd_avx512f(auVar108,auStack_131c0);
                            auStack_12e80 = vaddpd_avx512f(auVar101,auVar99);
                            auVar99 = vmulpd_avx512f(auVar108,auStack_13180);
                            auStack_12e40 = vaddpd_avx512f(auVar102,auVar99);
                            if (((this->m_kGQ).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows == 0x40) &&
                               ((this->m_kGQ).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols == 1)) {
                              pauVar88 = (undefined1 (*) [64])
                                         (this->m_kGQ).
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_data;
                              auVar99 = vmulpd_avx512f(auStack_11c80,auStack_10a80);
                              auVar100 = vmulpd_avx512f(auStack_12240,auStack_11040);
                              auVar101 = vmulpd_avx512f(auStack_11c40,auStack_10a40);
                              auStack_13000 = vmulpd_avx512f(auStack_13000,*pauVar88);
                              auVar102 = vmulpd_avx512f(auStack_12980,auStack_12980);
                              auVar104 = vmulpd_avx512f(auStack_12940,auStack_12940);
                              auStack_12fc0 = vmulpd_avx512f(auStack_12fc0,pauVar88[1]);
                              auStack_12f80 = vmulpd_avx512f(auStack_12f80,pauVar88[2]);
                              auStack_12f40 = vmulpd_avx512f(auStack_12f40,pauVar88[3]);
                              auStack_12f00 = vmulpd_avx512f(auStack_12f00,pauVar88[4]);
                              auStack_12ec0 = vmulpd_avx512f(auStack_12ec0,pauVar88[5]);
                              auVar105 = vmulpd_avx512f(auStack_122c0,auStack_110c0);
                              auStack_12e80 = vmulpd_avx512f(auStack_12e80,pauVar88[6]);
                              auVar106 = vmulpd_avx512f(auStack_11cc0,auStack_10ac0);
                              auStack_12e40 = vmulpd_avx512f(auStack_12e40,pauVar88[7]);
                              auVar107 = vmulpd_avx512f(auStack_12280,auStack_11080);
                              auVar108 = vmulpd_avx512f(auStack_12a00,auStack_11800);
                              auVar110 = vmulpd_avx512f(auStack_12400,auStack_11200);
                              auVar108 = vaddpd_avx512f(auVar108,auVar110);
                              auVar110 = vmulpd_avx512f(auStack_11e00,auStack_10c00);
                              auStack_13340._0_64_ = vaddpd_avx512f(auVar108,auVar110);
                              auVar108 = vmulpd_avx512f(auStack_123c0,auStack_111c0);
                              auVar110 = vmulpd_avx512f(auStack_129c0,auStack_117c0);
                              auVar108 = vaddpd_avx512f(auVar110,auVar108);
                              auVar110 = vmulpd_avx512f(auStack_11dc0,auStack_10bc0);
                              auStack_13340._64_64_ = vaddpd_avx512f(auVar108,auVar110);
                              auVar108 = vmulpd_avx512f(auStack_12980,auStack_11780);
                              auVar110 = vmulpd_avx512f(auStack_12380,auStack_11180);
                              auVar108 = vaddpd_avx512f(auVar108,auVar110);
                              auVar110 = vmulpd_avx512f(auStack_11d80,auStack_10b80);
                              auVar111 = vmulpd_avx512f(auStack_11d00,auStack_10b00);
                              auStack_132c0 = vaddpd_avx512f(auVar108,auVar110);
                              auVar108 = vmulpd_avx512f(auStack_12340,auStack_11140);
                              auVar110 = vmulpd_avx512f(auStack_12940,auStack_11740);
                              auVar108 = vaddpd_avx512f(auVar110,auVar108);
                              auVar110 = vmulpd_avx512f(auStack_11d40,auStack_10b40);
                              auVar112 = vmulpd_avx512f(auStack_12300,auStack_11100);
                              auStack_13280 = vaddpd_avx512f(auVar108,auVar110);
                              auVar108 = vmulpd_avx512f(auStack_12900,auStack_11700);
                              auVar110 = vmulpd_avx512f(auStack_12300,auStack_12300);
                              auVar108 = vaddpd_avx512f(auVar108,auVar112);
                              auVar112 = vmulpd_avx512f(auStack_11d00,auStack_11d00);
                              auStack_13240 = vaddpd_avx512f(auVar108,auVar111);
                              auVar108 = vmulpd_avx512f(auStack_128c0,auStack_116c0);
                              auVar111 = vmulpd_avx512f(auStack_128c0,auStack_128c0);
                              auVar105 = vaddpd_avx512f(auVar108,auVar105);
                              auVar108 = vmulpd_avx512f(auStack_12280,auStack_12280);
                              auStack_13200 = vaddpd_avx512f(auVar105,auVar106);
                              auVar105 = vmulpd_avx512f(auStack_12880,auStack_11680);
                              auVar106 = vmulpd_avx512f(auStack_12880,auStack_12880);
                              auVar105 = vaddpd_avx512f(auVar105,auVar107);
                              auStack_131c0 = vaddpd_avx512f(auVar105,auVar99);
                              auVar99 = vmulpd_avx512f(auStack_12840,auStack_11640);
                              auVar99 = vaddpd_avx512f(auVar99,auVar100);
                              auStack_13180 = vaddpd_avx512f(auVar99,auVar101);
                              auVar99 = vmulpd_avx512f(auStack_12a00,auStack_12a00);
                              auVar100 = vmulpd_avx512f(auStack_129c0,auStack_129c0);
                              auVar101 = vmulpd_avx512f(auStack_12400,auStack_12400);
                              auVar99 = vaddpd_avx512f(auVar99,auVar101);
                              auVar101 = vmulpd_avx512f(auStack_11e00,auStack_11e00);
                              auVar99 = vaddpd_avx512f(auVar99,auVar101);
                              auVar101 = vmulpd_avx512f(auStack_123c0,auStack_123c0);
                              auVar100 = vaddpd_avx512f(auVar100,auVar101);
                              auVar101 = vmulpd_avx512f(auStack_11dc0,auStack_11dc0);
                              auVar100 = vaddpd_avx512f(auVar100,auVar101);
                              auVar101 = vmulpd_avx512f(auStack_12380,auStack_12380);
                              auVar101 = vaddpd_avx512f(auVar102,auVar101);
                              auVar102 = vmulpd_avx512f(auStack_11d80,auStack_11d80);
                              auVar101 = vaddpd_avx512f(auVar101,auVar102);
                              auVar102 = vmulpd_avx512f(auStack_12340,auStack_12340);
                              auVar102 = vaddpd_avx512f(auVar104,auVar102);
                              auVar101 = vaddpd_avx512f(auVar101,auVar109);
                              auVar104 = vmulpd_avx512f(auStack_11d40,auStack_11d40);
                              auVar101 = vmulpd_avx512f(auVar101,auVar103);
                              auVar102 = vaddpd_avx512f(auVar102,auVar104);
                              auVar104 = vmulpd_avx512f(auStack_12900,auStack_12900);
                              auVar104 = vaddpd_avx512f(auVar104,auVar110);
                              auVar105 = vmulpd_avx512f(auStack_122c0,auStack_122c0);
                              auVar107 = vmulpd_avx512f(auStack_11cc0,auStack_11cc0);
                              auVar102 = vaddpd_avx512f(auVar102,auVar109);
                              auVar104 = vaddpd_avx512f(auVar104,auVar112);
                              auVar105 = vaddpd_avx512f(auVar111,auVar105);
                              auVar106 = vaddpd_avx512f(auVar106,auVar108);
                              auVar108 = vmulpd_avx512f(auStack_12840,auStack_12840);
                              auVar102 = vmulpd_avx512f(auVar102,auVar103);
                              auVar105 = vaddpd_avx512f(auVar105,auVar107);
                              auVar107 = vmulpd_avx512f(auStack_11c80,auStack_11c80);
                              auVar104 = vaddpd_avx512f(auVar104,auVar109);
                              auVar106 = vaddpd_avx512f(auVar106,auVar107);
                              auVar107 = vmulpd_avx512f(auStack_12240,auStack_12240);
                              auVar105 = vaddpd_avx512f(auVar105,auVar109);
                              auVar104 = vmulpd_avx512f(auVar104,auVar103);
                              auVar107 = vaddpd_avx512f(auVar108,auVar107);
                              auVar108 = vmulpd_avx512f(auStack_11c40,auStack_11c40);
                              auVar99 = vaddpd_avx512f(auVar99,auVar109);
                              auVar106 = vaddpd_avx512f(auVar106,auVar109);
                              auVar105 = vmulpd_avx512f(auVar105,auVar103);
                              auVar107 = vaddpd_avx512f(auVar107,auVar108);
                              auVar100 = vaddpd_avx512f(auVar100,auVar109);
                              auVar99 = vmulpd_avx512f(auVar99,auVar103);
                              auVar106 = vmulpd_avx512f(auVar106,auVar103);
                              auVar107 = vaddpd_avx512f(auVar107,auVar109);
                              auVar100 = vmulpd_avx512f(auVar100,auVar103);
                              auVar107 = vmulpd_avx512f(auVar107,auVar103);
                              local_c680.m_matrix = (non_const_type)this->m_Alpha;
                              auVar7._8_8_ = 0;
                              auVar7._0_8_ = local_c680.m_matrix;
                              auVar108 = vbroadcastsd_avx512f(auVar7);
                              auVar110 = vmulpd_avx512f(auVar108,auStack_13340._0_64_);
                              local_f000 = vaddpd_avx512f(auVar99,auVar110);
                              auVar99 = vmulpd_avx512f(auVar108,auStack_13340._64_64_);
                              local_efc0 = vaddpd_avx512f(auVar100,auVar99);
                              auVar99 = vmulpd_avx512f(auVar108,auStack_132c0);
                              local_ef80 = vaddpd_avx512f(auVar101,auVar99);
                              auVar99 = vmulpd_avx512f(auVar108,auStack_13280);
                              local_ef40 = vaddpd_avx512f(auVar102,auVar99);
                              auVar99 = vmulpd_avx512f(auVar108,auStack_13240);
                              local_ef00 = vaddpd_avx512f(auVar104,auVar99);
                              auVar99 = vmulpd_avx512f(auVar108,auStack_13200);
                              local_eec0 = vaddpd_avx512f(auVar105,auVar99);
                              auVar99 = vmulpd_avx512f(auVar108,auStack_131c0);
                              local_ee80 = vaddpd_avx512f(auVar106,auVar99);
                              auVar99 = vmulpd_avx512f(auVar108,auStack_13180);
                              local_ee40 = vaddpd_avx512f(auVar107,auVar99);
                              if (((this->m_kGQ).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_rows == 0x40) &&
                                 ((this->m_kGQ).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols == 1)) {
                                pauVar88 = (undefined1 (*) [64])
                                           (this->m_kGQ).
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_data;
                                auVar99 = vmulpd_avx512f(auStack_11a80,auStack_10880);
                                auVar100 = vmulpd_avx512f(auStack_12040,auStack_10e40);
                                auVar101 = vmulpd_avx512f(auStack_11a40,auStack_10840);
                                local_f000 = vmulpd_avx512f(local_f000,*pauVar88);
                                auVar102 = vmulpd_avx512f(auStack_12780,auStack_12780);
                                auVar104 = vmulpd_avx512f(auStack_12740,auStack_12740);
                                local_efc0 = vmulpd_avx512f(local_efc0,pauVar88[1]);
                                local_ef80 = vmulpd_avx512f(local_ef80,pauVar88[2]);
                                local_ef40 = vmulpd_avx512f(local_ef40,pauVar88[3]);
                                local_ef00 = vmulpd_avx512f(local_ef00,pauVar88[4]);
                                local_eec0 = vmulpd_avx512f(local_eec0,pauVar88[5]);
                                auVar105 = vmulpd_avx512f(auStack_120c0,auStack_10ec0);
                                local_ee80 = vmulpd_avx512f(local_ee80,pauVar88[6]);
                                auVar106 = vmulpd_avx512f(auStack_11ac0,auStack_108c0);
                                local_ee40 = vmulpd_avx512f(local_ee40,pauVar88[7]);
                                auVar107 = vmulpd_avx512f(auStack_12080,auStack_10e80);
                                auVar108 = vmulpd_avx512f(auStack_12800,auStack_11600);
                                auVar110 = vmulpd_avx512f(auStack_12200,auStack_11000);
                                auVar108 = vaddpd_avx512f(auVar108,auVar110);
                                auVar110 = vmulpd_avx512f(auStack_11c00,auStack_10a00);
                                auStack_13340._0_64_ = vaddpd_avx512f(auVar108,auVar110);
                                auVar108 = vmulpd_avx512f(auStack_121c0,auStack_10fc0);
                                auVar110 = vmulpd_avx512f(auStack_127c0,auStack_115c0);
                                auVar108 = vaddpd_avx512f(auVar110,auVar108);
                                auVar110 = vmulpd_avx512f(auStack_11bc0,auStack_109c0);
                                auStack_13340._64_64_ = vaddpd_avx512f(auVar108,auVar110);
                                auVar108 = vmulpd_avx512f(auStack_12780,auStack_11580);
                                auVar110 = vmulpd_avx512f(auStack_12180,auStack_10f80);
                                auVar108 = vaddpd_avx512f(auVar108,auVar110);
                                auVar110 = vmulpd_avx512f(auStack_11b80,auStack_10980);
                                auVar111 = vmulpd_avx512f(auStack_11b00,auStack_10900);
                                auStack_132c0 = vaddpd_avx512f(auVar108,auVar110);
                                auVar108 = vmulpd_avx512f(auStack_12140,auStack_10f40);
                                auVar110 = vmulpd_avx512f(auStack_12740,auStack_11540);
                                auVar108 = vaddpd_avx512f(auVar110,auVar108);
                                auVar110 = vmulpd_avx512f(auStack_11b40,auStack_10940);
                                auVar112 = vmulpd_avx512f(auStack_12100,auStack_10f00);
                                auStack_13280 = vaddpd_avx512f(auVar108,auVar110);
                                auVar108 = vmulpd_avx512f(auStack_12700,auStack_11500);
                                auVar110 = vmulpd_avx512f(auStack_12100,auStack_12100);
                                auVar108 = vaddpd_avx512f(auVar108,auVar112);
                                auVar112 = vmulpd_avx512f(auStack_11b00,auStack_11b00);
                                auStack_13240 = vaddpd_avx512f(auVar108,auVar111);
                                auVar108 = vmulpd_avx512f(auStack_126c0,auStack_114c0);
                                auVar111 = vmulpd_avx512f(auStack_126c0,auStack_126c0);
                                auVar105 = vaddpd_avx512f(auVar108,auVar105);
                                auVar108 = vmulpd_avx512f(auStack_12080,auStack_12080);
                                auStack_13200 = vaddpd_avx512f(auVar105,auVar106);
                                auVar105 = vmulpd_avx512f(auStack_12680,auStack_11480);
                                auVar106 = vmulpd_avx512f(auStack_12680,auStack_12680);
                                auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                auStack_131c0 = vaddpd_avx512f(auVar105,auVar99);
                                auVar99 = vmulpd_avx512f(auStack_12640,auStack_11440);
                                auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                auStack_13180 = vaddpd_avx512f(auVar99,auVar101);
                                auVar99 = vmulpd_avx512f(auStack_12800,auStack_12800);
                                auVar100 = vmulpd_avx512f(auStack_127c0,auStack_127c0);
                                auVar101 = vmulpd_avx512f(auStack_12200,auStack_12200);
                                auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                auVar101 = vmulpd_avx512f(auStack_11c00,auStack_11c00);
                                auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                auVar101 = vmulpd_avx512f(auStack_121c0,auStack_121c0);
                                auVar100 = vaddpd_avx512f(auVar100,auVar101);
                                auVar101 = vmulpd_avx512f(auStack_11bc0,auStack_11bc0);
                                auVar100 = vaddpd_avx512f(auVar100,auVar101);
                                auVar101 = vmulpd_avx512f(auStack_12180,auStack_12180);
                                auVar101 = vaddpd_avx512f(auVar102,auVar101);
                                auVar102 = vmulpd_avx512f(auStack_11b80,auStack_11b80);
                                auVar101 = vaddpd_avx512f(auVar101,auVar102);
                                auVar102 = vmulpd_avx512f(auStack_12140,auStack_12140);
                                auVar102 = vaddpd_avx512f(auVar104,auVar102);
                                auVar101 = vaddpd_avx512f(auVar101,auVar109);
                                auVar104 = vmulpd_avx512f(auStack_11b40,auStack_11b40);
                                auVar102 = vaddpd_avx512f(auVar102,auVar104);
                                auVar104 = vmulpd_avx512f(auStack_12700,auStack_12700);
                                auVar104 = vaddpd_avx512f(auVar104,auVar110);
                                auVar105 = vmulpd_avx512f(auStack_120c0,auStack_120c0);
                                auVar107 = vmulpd_avx512f(auStack_11ac0,auStack_11ac0);
                                auVar102 = vaddpd_avx512f(auVar102,auVar109);
                                auVar104 = vaddpd_avx512f(auVar104,auVar112);
                                auVar105 = vaddpd_avx512f(auVar111,auVar105);
                                auVar106 = vaddpd_avx512f(auVar106,auVar108);
                                auVar108 = vmulpd_avx512f(auStack_12640,auStack_12640);
                                auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                auVar107 = vmulpd_avx512f(auStack_11a80,auStack_11a80);
                                auVar104 = vaddpd_avx512f(auVar104,auVar109);
                                auVar106 = vaddpd_avx512f(auVar106,auVar107);
                                auVar107 = vmulpd_avx512f(auStack_12040,auStack_12040);
                                auVar105 = vaddpd_avx512f(auVar105,auVar109);
                                auVar107 = vaddpd_avx512f(auVar108,auVar107);
                                auVar108 = vmulpd_avx512f(auStack_11a40,auStack_11a40);
                                auVar99 = vaddpd_avx512f(auVar99,auVar109);
                                auVar106 = vaddpd_avx512f(auVar106,auVar109);
                                auVar105 = vmulpd_avx512f(auVar105,auVar103);
                                auVar107 = vaddpd_avx512f(auVar107,auVar108);
                                auVar100 = vaddpd_avx512f(auVar100,auVar109);
                                auVar106 = vmulpd_avx512f(auVar106,auVar103);
                                auVar107 = vaddpd_avx512f(auVar107,auVar109);
                                auVar99 = vmulpd_avx512f(auVar99,auVar103);
                                auVar100 = vmulpd_avx512f(auVar100,auVar103);
                                auVar101 = vmulpd_avx512f(auVar101,auVar103);
                                auVar102 = vmulpd_avx512f(auVar102,auVar103);
                                auVar104 = vmulpd_avx512f(auVar104,auVar103);
                                auVar103 = vmulpd_avx512f(auVar107,auVar103);
                                local_c680.m_matrix =
                                     (Matrix<double,__1,__1,_1,__1,__1> *)this->m_Alpha;
                                auVar8._8_8_ = 0;
                                auVar8._0_8_ = (Matrix<double,__1,__1,_1,__1,__1> *)this->m_Alpha;
                                auVar107 = vbroadcastsd_avx512f(auVar8);
                                auVar108 = vmulpd_avx512f(auVar107,auStack_13340._0_64_);
                                local_f200 = vaddpd_avx512f(auVar99,auVar108);
                                auVar99 = vmulpd_avx512f(auVar107,auStack_13340._64_64_);
                                local_f1c0 = vaddpd_avx512f(auVar100,auVar99);
                                auVar99 = vmulpd_avx512f(auVar107,auStack_132c0);
                                local_f180 = vaddpd_avx512f(auVar101,auVar99);
                                auVar99 = vmulpd_avx512f(auVar107,auStack_13280);
                                local_f140 = vaddpd_avx512f(auVar102,auVar99);
                                auVar99 = vmulpd_avx512f(auVar107,auStack_13240);
                                local_f100 = vaddpd_avx512f(auVar104,auVar99);
                                auVar99 = vmulpd_avx512f(auVar107,auStack_13200);
                                local_f0c0 = vaddpd_avx512f(auVar105,auVar99);
                                auVar99 = vmulpd_avx512f(auVar107,auStack_131c0);
                                local_f080 = vaddpd_avx512f(auVar106,auVar99);
                                auVar99 = vmulpd_avx512f(auVar107,auStack_13180);
                                local_f040 = vaddpd_avx512f(auVar103,auVar99);
                                if (((this->m_kGQ).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_rows == 0x40) &&
                                   ((this->m_kGQ).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols == 1)) {
                                  pauVar88 = (undefined1 (*) [64])
                                             (this->m_kGQ).
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             .m_storage.m_data;
                                  local_f200 = vmulpd_avx512f(local_f200,*pauVar88);
                                  local_f1c0 = vmulpd_avx512f(local_f1c0,pauVar88[1]);
                                  local_f180 = vmulpd_avx512f(local_f180,pauVar88[2]);
                                  local_f140 = vmulpd_avx512f(local_f140,pauVar88[3]);
                                  local_f100 = vmulpd_avx512f(local_f100,pauVar88[4]);
                                  local_f0c0 = vmulpd_avx512f(local_f0c0,pauVar88[5]);
                                  local_f080 = vmulpd_avx512f(local_f080,pauVar88[6]);
                                  local_f040 = vmulpd_avx512f(local_f040,pauVar88[7]);
                                  uVar85 = 0xfffffffffffffff8;
                                  do {
                                    auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                              (auStack_127c0 + uVar85 * 8),
                                                             *(undefined1 (*) [64])
                                                              (auStack_117c0 + uVar85 * 8));
                                    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                               (auStack_121c0 + uVar85 * 8),
                                                              *(undefined1 (*) [64])
                                                               (auStack_111c0 + uVar85 * 8));
                                    auVar101 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                               (auStack_129c0 + uVar85 * 8),
                                                              *(undefined1 (*) [64])
                                                               (auStack_115c0 + uVar85 * 8));
                                    auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                               (auStack_11bc0 + uVar85 * 8),
                                                              *(undefined1 (*) [64])
                                                               (auStack_10bc0 + uVar85 * 8));
                                    auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                    auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                               (auStack_123c0 + uVar85 * 8),
                                                              *(undefined1 (*) [64])
                                                               (auStack_10fc0 + uVar85 * 8));
                                    auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                    auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                               (auStack_11dc0 + uVar85 * 8),
                                                              *(undefined1 (*) [64])
                                                               (auStack_109c0 + uVar85 * 8));
                                    auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                    *(undefined1 (*) [64])(auStack_13340 + uVar85 * 8 + 0x40) =
                                         auVar99;
                                    uVar85 = uVar85 + 8;
                                  } while (uVar85 < 0x38);
                                  auVar99 = vmulpd_avx512f(auStack_12a00,auStack_12800);
                                  auVar100 = vmulpd_avx512f(auStack_12400,auStack_12200);
                                  auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                  auVar100 = vmulpd_avx512f(auStack_11e00,auStack_11c00);
                                  auVar101 = vmulpd_avx512f(auStack_129c0,auStack_127c0);
                                  auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                  auVar100 = vmulpd_avx512f(auStack_123c0,auStack_121c0);
                                  auVar100 = vaddpd_avx512f(auVar101,auVar100);
                                  auVar101 = vmulpd_avx512f(auStack_11dc0,auStack_11bc0);
                                  auVar100 = vaddpd_avx512f(auVar100,auVar101);
                                  auVar101 = vmulpd_avx512f(auStack_12980,auStack_12780);
                                  auVar102 = vmulpd_avx512f(auStack_12380,auStack_12180);
                                  auVar101 = vaddpd_avx512f(auVar101,auVar102);
                                  auVar102 = vmulpd_avx512f(auStack_11d80,auStack_11b80);
                                  auVar103 = vmulpd_avx512f(auStack_12340,auStack_12140);
                                  auVar101 = vaddpd_avx512f(auVar101,auVar102);
                                  auVar102 = vmulpd_avx512f(auStack_12940,auStack_12740);
                                  auVar102 = vaddpd_avx512f(auVar102,auVar103);
                                  auVar103 = vmulpd_avx512f(auStack_11d40,auStack_11b40);
                                  auVar102 = vaddpd_avx512f(auVar102,auVar103);
                                  auVar103 = vmulpd_avx512f(auStack_12900,auStack_12700);
                                  auVar104 = vmulpd_avx512f(auStack_12300,auStack_12100);
                                  auVar105 = vmulpd_avx512f(auStack_120c0,auStack_122c0);
                                  auVar103 = vaddpd_avx512f(auVar103,auVar104);
                                  auVar104 = vmulpd_avx512f(auStack_11d00,auStack_11b00);
                                  auVar106 = vmulpd_avx512f(auStack_11ac0,auStack_11cc0);
                                  auVar103 = vaddpd_avx512f(auVar103,auVar104);
                                  auVar104 = vmulpd_avx512f(auStack_126c0,auStack_128c0);
                                  auVar104 = vaddpd_avx512f(auVar104,auVar105);
                                  auVar105 = vmulpd_avx512f(auStack_12680,auStack_12880);
                                  auVar104 = vaddpd_avx512f(auVar104,auVar106);
                                  auVar106 = vmulpd_avx512f(auStack_12080,auStack_12280);
                                  auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                  auVar106 = vmulpd_avx512f(auStack_11a80,auStack_11c80);
                                  auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                  auVar106 = vmulpd_avx512f(auStack_12640,auStack_12840);
                                  auVar107 = vmulpd_avx512f(auStack_12040,auStack_12240);
                                  auVar106 = vaddpd_avx512f(auVar106,auVar107);
                                  auVar107 = vmulpd_avx512f(auStack_11a40,auStack_11c40);
                                  auVar106 = vaddpd_avx512f(auVar106,auVar107);
                                  local_c680.m_matrix = (non_const_type)this->m_Alpha;
                                  auVar9._8_8_ = 0;
                                  auVar9._0_8_ = local_c680.m_matrix;
                                  auVar107 = vbroadcastsd_avx512f(auVar9);
                                  auVar108 = vmulpd_avx512f(auVar107,auStack_13340._0_64_);
                                  local_f600 = vaddpd_avx512f(auVar108,auVar99);
                                  auVar99 = vmulpd_avx512f(auVar107,auStack_13340._64_64_);
                                  local_f5c0 = vaddpd_avx512f(auVar100,auVar99);
                                  auVar99 = vmulpd_avx512f(auVar107,auStack_132c0);
                                  local_f580 = vaddpd_avx512f(auVar101,auVar99);
                                  auVar99 = vmulpd_avx512f(auVar107,auStack_13280);
                                  local_f540 = vaddpd_avx512f(auVar102,auVar99);
                                  auVar99 = vmulpd_avx512f(auVar107,auStack_13240);
                                  local_f500 = vaddpd_avx512f(auVar103,auVar99);
                                  auVar99 = vmulpd_avx512f(auVar107,auStack_13200);
                                  local_f4c0 = vaddpd_avx512f(auVar104,auVar99);
                                  auVar99 = vmulpd_avx512f(auVar107,auStack_131c0);
                                  local_f480 = vaddpd_avx512f(auVar105,auVar99);
                                  auVar99 = vmulpd_avx512f(auVar107,auStack_13180);
                                  local_f440 = vaddpd_avx512f(auVar106,auVar99);
                                  if (((this->m_kGQ).
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_rows == 0x40) &&
                                     ((this->m_kGQ).
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_cols == 1)) {
                                    pauVar88 = (undefined1 (*) [64])
                                               (this->m_kGQ).
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_data;
                                    local_f600 = vmulpd_avx512f(local_f600,*pauVar88);
                                    local_f5c0 = vmulpd_avx512f(local_f5c0,pauVar88[1]);
                                    local_f580 = vmulpd_avx512f(local_f580,pauVar88[2]);
                                    local_f540 = vmulpd_avx512f(local_f540,pauVar88[3]);
                                    local_f500 = vmulpd_avx512f(local_f500,pauVar88[4]);
                                    local_f4c0 = vmulpd_avx512f(local_f4c0,pauVar88[5]);
                                    local_f480 = vmulpd_avx512f(local_f480,pauVar88[6]);
                                    local_f440 = vmulpd_avx512f(local_f440,pauVar88[7]);
                                    uVar85 = 0xfffffffffffffff8;
                                    do {
                                      auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                (auStack_127c0 + uVar85 * 8),
                                                               *(undefined1 (*) [64])
                                                                (auStack_119c0 + uVar85 * 8));
                                      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                 (auStack_121c0 + uVar85 * 8),
                                                                *(undefined1 (*) [64])
                                                                 (auStack_113c0 + uVar85 * 8));
                                      auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                 (auStack_11bc0 + uVar85 * 8),
                                                                *(undefined1 (*) [64])
                                                                 (auStack_10dc0 + uVar85 * 8));
                                      auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                 (auStack_12c00 + uVar85 * 8 + 0x40)
                                                                ,*(undefined1 (*) [64])
                                                                  (auStack_115c0 + uVar85 * 8));
                                      auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                 (auStack_125c0 + uVar85 * 8),
                                                                *(undefined1 (*) [64])
                                                                 (auStack_10fc0 + uVar85 * 8));
                                      auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                      auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                 (auStack_11fc0 + uVar85 * 8),
                                                                *(undefined1 (*) [64])
                                                                 (auStack_109c0 + uVar85 * 8));
                                      auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                      *(undefined1 (*) [64])(auStack_13340 + uVar85 * 8 + 0x40) =
                                           auVar99;
                                      uVar85 = uVar85 + 8;
                                    } while (uVar85 < 0x38);
                                    auVar99 = vmulpd_avx512f(auStack_12c00._0_64_,auStack_12800);
                                    auVar100 = vmulpd_avx512f(auStack_12600,auStack_12200);
                                    auVar101 = vmulpd_avx512f(auStack_12b80,auStack_12780);
                                    auVar10._8_8_ = 0;
                                    auVar10._0_8_ = local_c680.m_matrix;
                                    auVar102 = vbroadcastsd_avx512f(auVar10);
                                    auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                    auVar100 = vmulpd_avx512f(auStack_12000,auStack_11c00);
                                    auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                    auVar100 = vmulpd_avx512f(auStack_12c00._64_64_,auStack_127c0);
                                    auVar103 = vmulpd_avx512f(auStack_125c0,auStack_121c0);
                                    auVar100 = vaddpd_avx512f(auVar100,auVar103);
                                    auVar103 = vmulpd_avx512f(auStack_11fc0,auStack_11bc0);
                                    auVar100 = vaddpd_avx512f(auVar100,auVar103);
                                    auVar103 = vmulpd_avx512f(auStack_12580,auStack_12180);
                                    auVar101 = vaddpd_avx512f(auVar101,auVar103);
                                    auVar103 = vmulpd_avx512f(auStack_12b40,auStack_12740);
                                    auVar104 = vmulpd_avx512f(auStack_12540,auStack_12140);
                                    auVar105 = vmulpd_avx512f(auStack_11f80,auStack_11b80);
                                    auVar103 = vaddpd_avx512f(auVar103,auVar104);
                                    auVar104 = vmulpd_avx512f(auStack_11f40,auStack_11b40);
                                    auVar101 = vaddpd_avx512f(auVar101,auVar105);
                                    auVar105 = vmulpd_avx512f(auStack_12ac0,auStack_126c0);
                                    auVar103 = vaddpd_avx512f(auVar103,auVar104);
                                    auVar104 = vmulpd_avx512f(auStack_12b00,auStack_12700);
                                    auVar106 = vmulpd_avx512f(auStack_12500,auStack_12100);
                                    auVar104 = vaddpd_avx512f(auVar104,auVar106);
                                    auVar106 = vmulpd_avx512f(auStack_11f00,auStack_11b00);
                                    auVar104 = vaddpd_avx512f(auVar104,auVar106);
                                    auVar106 = vmulpd_avx512f(auStack_124c0,auStack_120c0);
                                    auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                    auVar106 = vmulpd_avx512f(auStack_11ec0,auStack_11ac0);
                                    auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                    auVar106 = vmulpd_avx512f(auStack_12a80,auStack_12680);
                                    auVar107 = vmulpd_avx512f(auStack_12a40,auStack_12640);
                                    auVar108 = vmulpd_avx512f(auStack_12480,auStack_12080);
                                    auVar109 = vmulpd_avx512f(auStack_12440,auStack_12040);
                                    auVar106 = vaddpd_avx512f(auVar106,auVar108);
                                    auVar107 = vaddpd_avx512f(auVar107,auVar109);
                                    auVar108 = vmulpd_avx512f(auStack_11e80,auStack_11a80);
                                    auVar106 = vaddpd_avx512f(auVar106,auVar108);
                                    auVar108 = vmulpd_avx512f(auStack_11e40,auStack_11a40);
                                    auVar107 = vaddpd_avx512f(auVar107,auVar108);
                                    auVar108 = vmulpd_avx512f(auVar102,auStack_13340._0_64_);
                                    local_f400 = vaddpd_avx512f(auVar99,auVar108);
                                    auVar99 = vmulpd_avx512f(auVar102,auStack_13340._64_64_);
                                    local_f3c0 = vaddpd_avx512f(auVar100,auVar99);
                                    auVar99 = vmulpd_avx512f(auVar102,auStack_132c0);
                                    local_f380 = vaddpd_avx512f(auVar101,auVar99);
                                    auVar99 = vmulpd_avx512f(auVar102,auStack_13280);
                                    local_f340 = vaddpd_avx512f(auVar103,auVar99);
                                    auVar99 = vmulpd_avx512f(auVar102,auStack_13240);
                                    local_f300 = vaddpd_avx512f(auVar104,auVar99);
                                    auVar99 = vmulpd_avx512f(auVar102,auStack_13200);
                                    local_f2c0 = vaddpd_avx512f(auVar105,auVar99);
                                    auVar99 = vmulpd_avx512f(auVar102,auStack_131c0);
                                    local_f280 = vaddpd_avx512f(auVar106,auVar99);
                                    auVar99 = vmulpd_avx512f(auVar102,auStack_13180);
                                    local_f240 = vaddpd_avx512f(auVar107,auVar99);
                                    if (((this->m_kGQ).
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_rows == 0x40) &&
                                       ((this->m_kGQ).
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                        .m_storage.m_cols == 1)) {
                                      pauVar88 = (undefined1 (*) [64])
                                                 (this->m_kGQ).
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                 .m_storage.m_data;
                                      local_f400 = vmulpd_avx512f(local_f400,*pauVar88);
                                      local_f3c0 = vmulpd_avx512f(local_f3c0,pauVar88[1]);
                                      local_f380 = vmulpd_avx512f(local_f380,pauVar88[2]);
                                      local_f340 = vmulpd_avx512f(local_f340,pauVar88[3]);
                                      local_f300 = vmulpd_avx512f(local_f300,pauVar88[4]);
                                      local_f2c0 = vmulpd_avx512f(local_f2c0,pauVar88[5]);
                                      local_f280 = vmulpd_avx512f(local_f280,pauVar88[6]);
                                      local_f240 = vmulpd_avx512f(local_f240,pauVar88[7]);
                                      uVar85 = 0xfffffffffffffff8;
                                      do {
                                        auVar99 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_129c0 + uVar85 * 8),
                                                                 *(undefined1 (*) [64])
                                                                  (auStack_119c0 + uVar85 * 8));
                                        auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                   (auStack_123c0 + uVar85 * 8),
                                                                  *(undefined1 (*) [64])
                                                                   (auStack_113c0 + uVar85 * 8));
                                        auVar101 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                   (auStack_12c00 +
                                                                   uVar85 * 8 + 0x40),
                                                                  *(undefined1 (*) [64])
                                                                   (auStack_117c0 + uVar85 * 8));
                                        auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                        auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                   (auStack_11dc0 + uVar85 * 8),
                                                                  *(undefined1 (*) [64])
                                                                   (auStack_10dc0 + uVar85 * 8));
                                        auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                        auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                        auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                   (auStack_125c0 + uVar85 * 8),
                                                                  *(undefined1 (*) [64])
                                                                   (auStack_111c0 + uVar85 * 8));
                                        auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                        auVar100 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                   (auStack_11fc0 + uVar85 * 8),
                                                                  *(undefined1 (*) [64])
                                                                   (auStack_10bc0 + uVar85 * 8));
                                        auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                        *(undefined1 (*) [64])(auStack_13340 + uVar85 * 8 + 0x40) =
                                             auVar99;
                                        uVar85 = uVar85 + 8;
                                      } while (uVar85 < 0x38);
                                      auVar99 = vmulpd_avx512f(auStack_12b00,auStack_12900);
                                      auVar100 = vmulpd_avx512f(auStack_12500,auStack_12300);
                                      auVar101 = vmulpd_avx512f(auStack_12ac0,auStack_128c0);
                                      auVar102 = vmulpd_avx512f(auStack_12440,auStack_12240);
                                      auVar103 = vmulpd_avx512f(auStack_12c00._0_64_,auStack_12a00);
                                      auVar104 = vmulpd_avx512f(auStack_12600,auStack_12400);
                                      auVar105 = vmulpd_avx512f(auStack_12c00._64_64_,auStack_129c0)
                                      ;
                                      auVar106 = vmulpd_avx512f(auStack_12b80,auStack_12980);
                                      auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                      auVar100 = vmulpd_avx512f(auStack_11f00,auStack_11d00);
                                      auVar103 = vaddpd_avx512f(auVar103,auVar104);
                                      auVar104 = vmulpd_avx512f(auStack_12000,auStack_11e00);
                                      auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                      auVar100 = vmulpd_avx512f(auStack_124c0,auStack_122c0);
                                      auVar103 = vaddpd_avx512f(auVar103,auVar104);
                                      auVar104 = vmulpd_avx512f(auStack_125c0,auStack_123c0);
                                      auVar100 = vaddpd_avx512f(auVar101,auVar100);
                                      auVar101 = vmulpd_avx512f(auStack_11ec0,auStack_11cc0);
                                      auVar104 = vaddpd_avx512f(auVar105,auVar104);
                                      auVar105 = vmulpd_avx512f(auStack_11fc0,auStack_11dc0);
                                      auVar100 = vaddpd_avx512f(auVar100,auVar101);
                                      auVar101 = vmulpd_avx512f(auStack_12a80,auStack_12880);
                                      auVar107 = vmulpd_avx512f(auStack_12480,auStack_12280);
                                      auVar104 = vaddpd_avx512f(auVar104,auVar105);
                                      auVar105 = vmulpd_avx512f(auStack_12580,auStack_12380);
                                      auVar101 = vaddpd_avx512f(auVar101,auVar107);
                                      auVar107 = vmulpd_avx512f(auStack_11e80,auStack_11c80);
                                      auVar105 = vaddpd_avx512f(auVar106,auVar105);
                                      auVar106 = vmulpd_avx512f(auStack_11f80,auStack_11d80);
                                      auVar101 = vaddpd_avx512f(auVar101,auVar107);
                                      auVar107 = vmulpd_avx512f(auStack_12a40,auStack_12840);
                                      auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                      auVar106 = vmulpd_avx512f(auStack_12b40,auStack_12940);
                                      auVar108 = vmulpd_avx512f(auStack_12540,auStack_12340);
                                      auVar102 = vaddpd_avx512f(auVar107,auVar102);
                                      auVar107 = vmulpd_avx512f(auStack_11e40,auStack_11c40);
                                      auVar106 = vaddpd_avx512f(auVar106,auVar108);
                                      auVar108 = vmulpd_avx512f(auStack_11f40,auStack_11d40);
                                      auVar102 = vaddpd_avx512f(auVar102,auVar107);
                                      auVar106 = vaddpd_avx512f(auVar106,auVar108);
                                      local_c680.m_matrix = (non_const_type)this->m_Alpha;
                                      auVar11._8_8_ = 0;
                                      auVar11._0_8_ = local_c680.m_matrix;
                                      auVar107 = vbroadcastsd_avx512f(auVar11);
                                      auVar108 = vmulpd_avx512f(auVar107,auStack_13340._0_64_);
                                      local_e800 = vaddpd_avx512f(auVar103,auVar108);
                                      auVar103 = vmulpd_avx512f(auVar107,auStack_13340._64_64_);
                                      local_e7c0 = vaddpd_avx512f(auVar104,auVar103);
                                      auVar103 = vmulpd_avx512f(auVar107,auStack_132c0);
                                      local_e780 = vaddpd_avx512f(auVar105,auVar103);
                                      auVar103 = vmulpd_avx512f(auVar107,auStack_13280);
                                      local_e740 = vaddpd_avx512f(auVar106,auVar103);
                                      auVar103 = vmulpd_avx512f(auVar107,auStack_13240);
                                      local_e700 = vaddpd_avx512f(auVar99,auVar103);
                                      auVar99 = vmulpd_avx512f(auVar107,auStack_13200);
                                      local_e6c0 = vaddpd_avx512f(auVar100,auVar99);
                                      auVar99 = vmulpd_avx512f(auVar107,auStack_131c0);
                                      local_e680 = vaddpd_avx512f(auVar101,auVar99);
                                      auVar99 = vmulpd_avx512f(auVar107,auStack_13180);
                                      local_e640 = vaddpd_avx512f(auVar102,auVar99);
                                      if (((this->m_kGQ).
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_rows == 0x40) &&
                                         ((this->m_kGQ).
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_cols == 1)) {
                                        pauVar88 = (undefined1 (*) [64])
                                                   (this->m_kGQ).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                        puStack_13348 = local_e800;
                                        puStack_13398 = local_f600;
                                        puStack_13368 = local_f400;
                                        uVar85 = 0xfffffffffffffff8;
                                        local_e800 = vmulpd_avx512f(local_e800,*pauVar88);
                                        local_e7c0 = vmulpd_avx512f(local_e7c0,pauVar88[1]);
                                        local_e780 = vmulpd_avx512f(local_e780,pauVar88[2]);
                                        local_e740 = vmulpd_avx512f(local_e740,pauVar88[3]);
                                        local_e700 = vmulpd_avx512f(local_e700,pauVar88[4]);
                                        local_e6c0 = vmulpd_avx512f(local_e6c0,pauVar88[5]);
                                        local_e680 = vmulpd_avx512f(local_e680,pauVar88[6]);
                                        local_e640 = vmulpd_avx512f(local_e640,pauVar88[7]);
                                        local_c680.m_matrix =
                                             (non_const_type)
                                             (peVar50->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0];
                                        local_d700._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 8);
                                        local_db00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x10);
                                        local_dd00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x18);
                                        local_ea00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x20);
                                        local_ec00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x28);
                                        pMStack_c678 = (Matrix<double,_192,_6,_0,_192,_6> *)
                                                       auStack_13000;
                                        local_d700._8_8_ =
                                             (DenseStorage<double,__1,__1,__1,_1> *)local_f000;
                                        puStack_daf8 = local_f200;
                                        puStack_dcf8 = puStack_13398;
                                        puStack_e9f8 = puStack_13368;
                                        puStack_ebf8 = puStack_13348;
                                        auVar12._8_8_ = 0;
                                        auVar12._0_8_ = local_c680.m_matrix;
                                        auVar99 = vbroadcastsd_avx512f(auVar12);
                                        auVar13._8_8_ = 0;
                                        auVar13._0_8_ = local_d700._0_8_;
                                        auVar100 = vbroadcastsd_avx512f(auVar13);
                                        auVar14._8_8_ = 0;
                                        auVar14._0_8_ = local_db00;
                                        auVar101 = vbroadcastsd_avx512f(auVar14);
                                        auVar15._8_8_ = 0;
                                        auVar15._0_8_ = local_dd00;
                                        auVar102 = vbroadcastsd_avx512f(auVar15);
                                        auVar16._8_8_ = 0;
                                        auVar16._0_8_ = local_ea00;
                                        auVar103 = vbroadcastsd_avx512f(auVar16);
                                        auVar17._8_8_ = 0;
                                        auVar17._0_8_ = local_ec00;
                                        auVar104 = vbroadcastsd_avx512f(auVar17);
                                        do {
                                          auVar105 = vmulpd_avx512f(auVar99,*(undefined1 (*) [64])
                                                                             (auStack_12fc0 +
                                                                             uVar85 * 8));
                                          auVar106 = vmulpd_avx512f(auVar100,*(undefined1 (*) [64])
                                                                              (local_efc0 +
                                                                              uVar85 * 8));
                                          auVar107 = vmulpd_avx512f(auVar101,*(undefined1 (*) [64])
                                                                              (local_f1c0 +
                                                                              uVar85 * 8));
                                          auVar108 = vmulpd_avx512f(auVar102,*(undefined1 (*) [64])
                                                                              (local_f5c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          auVar106 = vmulpd_avx512f(auVar103,*(undefined1 (*) [64])
                                                                              (local_f3c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar108);
                                          auVar107 = vmulpd_avx512f(auVar104,*(undefined1 (*) [64])
                                                                              (local_e7c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          *(undefined1 (*) [64])(&local_d8c0 + uVar85) = auVar105;
                                          uVar85 = uVar85 + 8;
                                        } while (uVar85 < 0x38);
                                        local_c680.m_matrix =
                                             *(non_const_type *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x30);
                                        local_d700._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x38);
                                        local_dd00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x40);
                                        local_ea00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x48);
                                        local_ec00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x50);
                                        local_ee00 = *(undefined1 (**) [64])
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x58);
                                        uVar85 = 0xfffffffffffffff8;
                                        puStack_dcf8 = local_f200;
                                        puStack_e9f8 = puStack_13398;
                                        puStack_ebf8 = puStack_13368;
                                        puStack_edf8 = puStack_13348;
                                        auVar18._8_8_ = 0;
                                        auVar18._0_8_ = local_c680.m_matrix;
                                        auVar99 = vbroadcastsd_avx512f(auVar18);
                                        auVar19._8_8_ = 0;
                                        auVar19._0_8_ = local_d700._0_8_;
                                        auVar100 = vbroadcastsd_avx512f(auVar19);
                                        auVar20._8_8_ = 0;
                                        auVar20._0_8_ = local_dd00;
                                        auVar101 = vbroadcastsd_avx512f(auVar20);
                                        auVar21._8_8_ = 0;
                                        auVar21._0_8_ = local_ea00;
                                        auVar102 = vbroadcastsd_avx512f(auVar21);
                                        auVar22._8_8_ = 0;
                                        auVar22._0_8_ = local_ec00;
                                        auVar103 = vbroadcastsd_avx512f(auVar22);
                                        auVar23._8_8_ = 0;
                                        auVar23._0_8_ = local_ee00;
                                        auVar104 = vbroadcastsd_avx512f(auVar23);
                                        do {
                                          auVar105 = vmulpd_avx512f(auVar99,*(undefined1 (*) [64])
                                                                             (auStack_12fc0 +
                                                                             uVar85 * 8));
                                          auVar106 = vmulpd_avx512f(auVar100,*(undefined1 (*) [64])
                                                                              (local_efc0 +
                                                                              uVar85 * 8));
                                          auVar107 = vmulpd_avx512f(auVar101,*(undefined1 (*) [64])
                                                                              (local_f1c0 +
                                                                              uVar85 * 8));
                                          auVar108 = vmulpd_avx512f(auVar102,*(undefined1 (*) [64])
                                                                              (local_f5c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          auVar106 = vmulpd_avx512f(auVar103,*(undefined1 (*) [64])
                                                                              (local_f3c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar108);
                                          auVar107 = vmulpd_avx512f(auVar104,*(undefined1 (*) [64])
                                                                              (local_e7c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          *(undefined1 (*) [64])(&local_dac0 + uVar85) = auVar105;
                                          uVar85 = uVar85 + 8;
                                        } while (uVar85 < 0x38);
                                        local_c680.m_matrix =
                                             *(non_const_type *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x60);
                                        local_d700._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x68);
                                        local_ea00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x70);
                                        local_ec00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x78);
                                        local_ee00 = *(undefined1 (**) [64])
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x80);
                                        uVar85 = 0xfffffffffffffff8;
                                        puStack_e9f8 = local_f200;
                                        puStack_ebf8 = puStack_13398;
                                        puStack_edf8 = puStack_13368;
                                        auVar24._8_8_ = 0;
                                        auVar24._0_8_ = local_c680.m_matrix;
                                        auVar99 = vbroadcastsd_avx512f(auVar24);
                                        auVar25._8_8_ = 0;
                                        auVar25._0_8_ = local_d700._0_8_;
                                        auVar100 = vbroadcastsd_avx512f(auVar25);
                                        auVar26._8_8_ = 0;
                                        auVar26._0_8_ = local_ea00;
                                        auVar101 = vbroadcastsd_avx512f(auVar26);
                                        auVar27._8_8_ = 0;
                                        auVar27._0_8_ = local_ec00;
                                        auVar102 = vbroadcastsd_avx512f(auVar27);
                                        auVar28._8_8_ = 0;
                                        auVar28._0_8_ = local_ee00;
                                        auVar103 = vbroadcastsd_avx512f(auVar28);
                                        auVar29._8_8_ = 0;
                                        auVar29._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x88);
                                        auVar104 = vbroadcastsd_avx512f(auVar29);
                                        do {
                                          auVar105 = vmulpd_avx512f(auVar99,*(undefined1 (*) [64])
                                                                             (auStack_12fc0 +
                                                                             uVar85 * 8));
                                          auVar106 = vmulpd_avx512f(auVar100,*(undefined1 (*) [64])
                                                                              (local_efc0 +
                                                                              uVar85 * 8));
                                          auVar107 = vmulpd_avx512f(auVar101,*(undefined1 (*) [64])
                                                                              (local_f1c0 +
                                                                              uVar85 * 8));
                                          auVar108 = vmulpd_avx512f(auVar102,*(undefined1 (*) [64])
                                                                              (local_f5c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          auVar106 = vmulpd_avx512f(auVar103,*(undefined1 (*) [64])
                                                                              (local_f3c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar108);
                                          auVar107 = vmulpd_avx512f(auVar104,*(undefined1 (*) [64])
                                                                              (local_e7c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          *(undefined1 (*) [64])(&local_dcc0 + uVar85) = auVar105;
                                          uVar85 = uVar85 + 8;
                                        } while (uVar85 < 0x38);
                                        local_c680.m_matrix =
                                             *(non_const_type *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x90);
                                        local_d700._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x98);
                                        local_ec00 = *(double *)
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xa0);
                                        local_ee00 = *(undefined1 (**) [64])
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xa8);
                                        uVar85 = 0xfffffffffffffff8;
                                        puStack_ebf8 = local_f200;
                                        puStack_edf8 = puStack_13398;
                                        auVar30._8_8_ = 0;
                                        auVar30._0_8_ = local_c680.m_matrix;
                                        auVar99 = vbroadcastsd_avx512f(auVar30);
                                        auVar31._8_8_ = 0;
                                        auVar31._0_8_ = local_d700._0_8_;
                                        auVar100 = vbroadcastsd_avx512f(auVar31);
                                        auVar32._8_8_ = 0;
                                        auVar32._0_8_ = local_ec00;
                                        auVar101 = vbroadcastsd_avx512f(auVar32);
                                        auVar33._8_8_ = 0;
                                        auVar33._0_8_ = local_ee00;
                                        auVar102 = vbroadcastsd_avx512f(auVar33);
                                        auVar34._8_8_ = 0;
                                        auVar34._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xb0);
                                        auVar103 = vbroadcastsd_avx512f(auVar34);
                                        auVar35._8_8_ = 0;
                                        auVar35._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xb8);
                                        auVar104 = vbroadcastsd_avx512f(auVar35);
                                        do {
                                          auVar105 = vmulpd_avx512f(auVar99,*(undefined1 (*) [64])
                                                                             (auStack_12fc0 +
                                                                             uVar85 * 8));
                                          auVar106 = vmulpd_avx512f(auVar100,*(undefined1 (*) [64])
                                                                              (local_efc0 +
                                                                              uVar85 * 8));
                                          auVar107 = vmulpd_avx512f(auVar101,*(undefined1 (*) [64])
                                                                              (local_f1c0 +
                                                                              uVar85 * 8));
                                          auVar108 = vmulpd_avx512f(auVar102,*(undefined1 (*) [64])
                                                                              (local_f5c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          auVar106 = vmulpd_avx512f(auVar103,*(undefined1 (*) [64])
                                                                              (local_f3c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar108);
                                          auVar107 = vmulpd_avx512f(auVar104,*(undefined1 (*) [64])
                                                                              (local_e7c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          *(undefined1 (*) [64])(&local_e9c0 + uVar85) = auVar105;
                                          uVar85 = uVar85 + 8;
                                        } while (uVar85 < 0x38);
                                        local_c680.m_matrix =
                                             *(non_const_type *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xc0);
                                        local_d700._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 200);
                                        local_ee00 = *(undefined1 (**) [64])
                                                      ((long)(peVar50->m_D).
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xd0);
                                        uVar85 = 0xfffffffffffffff8;
                                        puStack_edf8 = local_f200;
                                        auVar36._8_8_ = 0;
                                        auVar36._0_8_ = local_c680.m_matrix;
                                        auVar99 = vbroadcastsd_avx512f(auVar36);
                                        auVar37._8_8_ = 0;
                                        auVar37._0_8_ = local_d700._0_8_;
                                        auVar100 = vbroadcastsd_avx512f(auVar37);
                                        auVar38._8_8_ = 0;
                                        auVar38._0_8_ = local_ee00;
                                        auVar101 = vbroadcastsd_avx512f(auVar38);
                                        auVar39._8_8_ = 0;
                                        auVar39._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xd8);
                                        auVar102 = vbroadcastsd_avx512f(auVar39);
                                        auVar40._8_8_ = 0;
                                        auVar40._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xe0);
                                        auVar103 = vbroadcastsd_avx512f(auVar40);
                                        auVar41._8_8_ = 0;
                                        auVar41._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xe8);
                                        auVar104 = vbroadcastsd_avx512f(auVar41);
                                        do {
                                          auVar105 = vmulpd_avx512f(auVar99,*(undefined1 (*) [64])
                                                                             (auStack_12fc0 +
                                                                             uVar85 * 8));
                                          auVar106 = vmulpd_avx512f(auVar100,*(undefined1 (*) [64])
                                                                              (local_efc0 +
                                                                              uVar85 * 8));
                                          auVar107 = vmulpd_avx512f(auVar101,*(undefined1 (*) [64])
                                                                              (local_f1c0 +
                                                                              uVar85 * 8));
                                          auVar108 = vmulpd_avx512f(auVar102,*(undefined1 (*) [64])
                                                                              (local_f5c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          auVar106 = vmulpd_avx512f(auVar103,*(undefined1 (*) [64])
                                                                              (local_f3c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar108);
                                          auVar107 = vmulpd_avx512f(auVar104,*(undefined1 (*) [64])
                                                                              (local_e7c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          *(undefined1 (*) [64])(local_ebc0 + uVar85 * 8) = auVar105
                                          ;
                                          uVar85 = uVar85 + 8;
                                        } while (uVar85 < 0x38);
                                        local_c680.m_matrix =
                                             *(non_const_type *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xf0);
                                        local_d700._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0xf8);
                                        dStack_133a0 = *(double *)
                                                        ((long)(peVar50->m_D).
                                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x108);
                                        dStack_13370 = *(double *)
                                                        ((long)(peVar50->m_D).
                                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x110);
                                        dStack_13350 = *(double *)
                                                        ((long)(peVar50->m_D).
                                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x118);
                                        uVar85 = 0xfffffffffffffff8;
                                        auVar42._8_8_ = 0;
                                        auVar42._0_8_ = local_c680.m_matrix;
                                        auVar99 = vbroadcastsd_avx512f(auVar42);
                                        auVar43._8_8_ = 0;
                                        auVar43._0_8_ = local_d700._0_8_;
                                        auVar100 = vbroadcastsd_avx512f(auVar43);
                                        auVar44._8_8_ = 0;
                                        auVar44._0_8_ =
                                             *(double *)
                                              ((long)(peVar50->m_D).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array + 0x100);
                                        auVar101 = vbroadcastsd_avx512f(auVar44);
                                        auVar45._8_8_ = 0;
                                        auVar45._0_8_ = dStack_133a0;
                                        auVar102 = vbroadcastsd_avx512f(auVar45);
                                        auVar46._8_8_ = 0;
                                        auVar46._0_8_ = dStack_13370;
                                        auVar103 = vbroadcastsd_avx512f(auVar46);
                                        auVar47._8_8_ = 0;
                                        auVar47._0_8_ = dStack_13350;
                                        auVar104 = vbroadcastsd_avx512f(auVar47);
                                        do {
                                          auVar105 = vmulpd_avx512f(auVar99,*(undefined1 (*) [64])
                                                                             (auStack_12fc0 +
                                                                             uVar85 * 8));
                                          auVar106 = vmulpd_avx512f(auVar100,*(undefined1 (*) [64])
                                                                              (local_efc0 +
                                                                              uVar85 * 8));
                                          auVar107 = vmulpd_avx512f(auVar101,*(undefined1 (*) [64])
                                                                              (local_f1c0 +
                                                                              uVar85 * 8));
                                          auVar108 = vmulpd_avx512f(auVar102,*(undefined1 (*) [64])
                                                                              (local_f5c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          auVar106 = vmulpd_avx512f(auVar103,*(undefined1 (*) [64])
                                                                              (local_f3c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar108);
                                          auVar107 = vmulpd_avx512f(auVar104,*(undefined1 (*) [64])
                                                                              (local_e7c0 +
                                                                              uVar85 * 8));
                                          auVar105 = vaddpd_avx512f(auVar105,auVar106);
                                          auVar105 = vaddpd_avx512f(auVar105,auVar107);
                                          *(undefined1 (*) [64])(&local_edc0 + uVar85) = auVar105;
                                          uVar85 = uVar85 + 8;
                                        } while (uVar85 < 0x38);
                                        uVar85 = (this->m_SD).
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                 .m_storage.m_cols;
                                        if (0x3f < (long)uVar85) {
                                          auVar102._8_8_ = puStack_ebf8;
                                          auVar102._0_8_ = local_ec00;
                                          auVar102._16_48_ = auStack_ebf0;
                                          uVar51 = (this->m_SD).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_rows;
                                          pauVar82 = (undefined1 (*) [64])
                                                     (this->m_SD).
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_data;
                                          pauVar88 = (undefined1 (*) [64])local_c0c0;
                                          uVar93 = 0;
                                          local_dd80 = local_d8c0;
                                          uStack_dd78 = uStack_d8b8;
                                          uStack_dd70 = uStack_d8b0;
                                          uStack_dd68 = uStack_d8a8;
                                          uStack_dd60 = uStack_d8a0;
                                          uStack_dd58 = uStack_d898;
                                          uStack_dd50 = uStack_d890;
                                          uStack_dd48 = uStack_d888;
                                          local_ddc0 = local_d880;
                                          uStack_ddb8 = uStack_d878;
                                          uStack_ddb0 = uStack_d870;
                                          uStack_dda8 = uStack_d868;
                                          uStack_dda0 = uStack_d860;
                                          uStack_dd98 = uStack_d858;
                                          uStack_dd90 = uStack_d850;
                                          uStack_dd88 = uStack_d848;
                                          local_dd40 = local_d900;
                                          uStack_dd38 = uStack_d8f8;
                                          uStack_dd30 = uStack_d8f0;
                                          uStack_dd28 = uStack_d8e8;
                                          uStack_dd20 = uStack_d8e0;
                                          uStack_dd18 = uStack_d8d8;
                                          uStack_dd10 = uStack_d8d0;
                                          uStack_dd08 = uStack_d8c8;
                                          local_e540 = local_eb00;
                                          local_e580 = local_eac0;
                                          local_e5c0 = local_ea80;
                                          local_e600 = local_ea40;
                                          local_de00 = local_d840;
                                          uStack_ddf8 = uStack_d838;
                                          uStack_ddf0 = uStack_d830;
                                          uStack_dde8 = uStack_d828;
                                          uStack_dde0 = uStack_d820;
                                          uStack_ddd8 = uStack_d818;
                                          uStack_ddd0 = uStack_d810;
                                          uStack_ddc8 = uStack_d808;
                                          pauStack_12c40 = local_ee00;
                                          puStack_12c38 = puStack_edf8;
                                          dStack_12c30 = dStack_edf0;
                                          dStack_12c28 = dStack_ede8;
                                          dStack_12c20 = dStack_ede0;
                                          dStack_12c18 = dStack_edd8;
                                          dStack_12c10 = dStack_edd0;
                                          dStack_12c08 = dStack_edc8;
                                          dStack_12c80 = local_edc0;
                                          dStack_12c78 = dStack_edb8;
                                          dStack_12c70 = dStack_edb0;
                                          dStack_12c68 = dStack_eda8;
                                          dStack_12c60 = dStack_eda0;
                                          dStack_12c58 = dStack_ed98;
                                          dStack_12c50 = dStack_ed90;
                                          dStack_12c48 = dStack_ed88;
                                          bStack_12cc0 = SUB81(local_ed80,0);
                                          uStack_12cbf = (undefined7)((ulong)local_ed80 >> 8);
                                          dStack_12cb8 = dStack_ed78;
                                          dStack_12cb0 = dStack_ed70;
                                          dStack_12ca8 = dStack_ed68;
                                          dStack_12ca0 = dStack_ed60;
                                          dStack_12c98 = dStack_ed58;
                                          dStack_12c90 = dStack_ed50;
                                          dStack_12c88 = dStack_ed48;
                                          pCStack_12d00 = local_ed40;
                                          dStack_12cf8 = dStack_ed38;
                                          dStack_12cf0 = dStack_ed30;
                                          dStack_12ce8 = dStack_ed28;
                                          dStack_12ce0 = dStack_ed20;
                                          dStack_12cd8 = dStack_ed18;
                                          dStack_12cd0 = dStack_ed10;
                                          dStack_12cc8 = dStack_ed08;
                                          local_de40 = local_d800;
                                          uStack_de38 = uStack_d7f8;
                                          uStack_de30 = uStack_d7f0;
                                          uStack_de28 = uStack_d7e8;
                                          uStack_de20 = uStack_d7e0;
                                          uStack_de18 = uStack_d7d8;
                                          uStack_de10 = uStack_d7d0;
                                          uStack_de08 = uStack_d7c8;
                                          pdStack_12d40 = local_ed00;
                                          dStack_12d38 = dStack_ecf8;
                                          dStack_12d30 = dStack_ecf0;
                                          dStack_12d28 = dStack_ece8;
                                          dStack_12d20 = dStack_ece0;
                                          dStack_12d18 = dStack_ecd8;
                                          dStack_12d10 = dStack_ecd0;
                                          dStack_12d08 = dStack_ecc8;
                                          local_de80 = local_d7c0;
                                          uStack_de78 = uStack_d7b8;
                                          uStack_de70 = uStack_d7b0;
                                          uStack_de68 = uStack_d7a8;
                                          uStack_de60 = uStack_d7a0;
                                          uStack_de58 = uStack_d798;
                                          uStack_de50 = uStack_d790;
                                          uStack_de48 = uStack_d788;
                                          dStack_12d80 = local_ecc0;
                                          dStack_12d78 = dStack_ecb8;
                                          dStack_12d70 = dStack_ecb0;
                                          dStack_12d68 = dStack_eca8;
                                          dStack_12d60 = dStack_eca0;
                                          dStack_12d58 = dStack_ec98;
                                          dStack_12d50 = dStack_ec90;
                                          dStack_12d48 = dStack_ec88;
                                          local_dec0 = local_d780;
                                          uStack_deb8 = uStack_d778;
                                          uStack_deb0 = uStack_d770;
                                          uStack_dea8 = uStack_d768;
                                          uStack_dea0 = uStack_d760;
                                          uStack_de98 = uStack_d758;
                                          uStack_de90 = uStack_d750;
                                          uStack_de88 = uStack_d748;
                                          pdStack_12dc0 = local_ec80;
                                          dStack_12db8 = dStack_ec78;
                                          dStack_12db0 = dStack_ec70;
                                          dStack_12da8 = dStack_ec68;
                                          dStack_12da0 = dStack_ec60;
                                          dStack_12d98 = dStack_ec58;
                                          dStack_12d90 = dStack_ec50;
                                          dStack_12d88 = dStack_ec48;
                                          local_df00 = local_d740;
                                          uStack_def8 = uStack_d738;
                                          uStack_def0 = uStack_d730;
                                          uStack_dee8 = uStack_d728;
                                          uStack_dee0 = uStack_d720;
                                          uStack_ded8 = uStack_d718;
                                          uStack_ded0 = uStack_d710;
                                          uStack_dec8 = uStack_d708;
                                          pdStack_12e00 = local_ec40;
                                          dStack_12df8 = dStack_ec38;
                                          dStack_12df0 = dStack_ec30;
                                          dStack_12de8 = dStack_ec28;
                                          dStack_12de0 = dStack_ec20;
                                          dStack_12dd8 = dStack_ec18;
                                          dStack_12dd0 = dStack_ec10;
                                          dStack_12dc8 = dStack_ec08;
                                          local_df40 = local_db00;
                                          puStack_df38 = puStack_daf8;
                                          uStack_df30 = uStack_daf0;
                                          uStack_df28 = uStack_dae8;
                                          uStack_df20 = uStack_dae0;
                                          uStack_df18 = uStack_dad8;
                                          uStack_df10 = uStack_dad0;
                                          uStack_df08 = uStack_dac8;
                                          local_df80 = local_dac0;
                                          uStack_df78 = uStack_dab8;
                                          uStack_df70 = uStack_dab0;
                                          uStack_df68 = uStack_daa8;
                                          uStack_df60 = uStack_daa0;
                                          uStack_df58 = uStack_da98;
                                          uStack_df50 = uStack_da90;
                                          uStack_df48 = uStack_da88;
                                          local_dfc0 = local_da80;
                                          uStack_dfb8 = uStack_da78;
                                          uStack_dfb0 = uStack_da70;
                                          uStack_dfa8 = uStack_da68;
                                          uStack_dfa0 = uStack_da60;
                                          uStack_df98 = uStack_da58;
                                          uStack_df90 = uStack_da50;
                                          uStack_df88 = uStack_da48;
                                          local_e000 = local_da40;
                                          uStack_dff8 = uStack_da38;
                                          uStack_dff0 = uStack_da30;
                                          uStack_dfe8 = uStack_da28;
                                          uStack_dfe0 = uStack_da20;
                                          uStack_dfd8 = uStack_da18;
                                          uStack_dfd0 = uStack_da10;
                                          uStack_dfc8 = uStack_da08;
                                          local_e040 = local_ea00;
                                          puStack_e038 = puStack_e9f8;
                                          uStack_e030 = uStack_e9f0;
                                          uStack_e028 = uStack_e9e8;
                                          uStack_e020 = uStack_e9e0;
                                          uStack_e018 = uStack_e9d8;
                                          uStack_e010 = uStack_e9d0;
                                          uStack_e008 = uStack_e9c8;
                                          local_e080 = local_e9c0;
                                          uStack_e078 = uStack_e9b8;
                                          uStack_e070 = uStack_e9b0;
                                          uStack_e068 = uStack_e9a8;
                                          uStack_e060 = uStack_e9a0;
                                          uStack_e058 = uStack_e998;
                                          uStack_e050 = uStack_e990;
                                          uStack_e048 = uStack_e988;
                                          local_e0c0 = local_e980;
                                          uStack_e0b8 = uStack_e978;
                                          uStack_e0b0 = uStack_e970;
                                          uStack_e0a8 = uStack_e968;
                                          uStack_e0a0 = uStack_e960;
                                          uStack_e098 = uStack_e958;
                                          uStack_e090 = uStack_e950;
                                          uStack_e088 = uStack_e948;
                                          auVar104._8_8_ = uStack_e978;
                                          auVar104._0_8_ = local_e980;
                                          auVar104._16_8_ = uStack_e970;
                                          auVar104._24_8_ = uStack_e968;
                                          auVar104._32_8_ = uStack_e960;
                                          auVar104._40_8_ = uStack_e958;
                                          auVar104._48_8_ = uStack_e950;
                                          auVar104._56_8_ = uStack_e948;
                                          local_e100 = local_e940;
                                          uStack_e0f8 = uStack_e938;
                                          uStack_e0f0 = uStack_e930;
                                          uStack_e0e8 = uStack_e928;
                                          uStack_e0e0 = uStack_e920;
                                          uStack_e0d8 = uStack_e918;
                                          uStack_e0d0 = uStack_e910;
                                          uStack_e0c8 = uStack_e908;
                                          local_e140 = local_da00;
                                          uStack_e138 = uStack_d9f8;
                                          uStack_e130 = uStack_d9f0;
                                          uStack_e128 = uStack_d9e8;
                                          uStack_e120 = uStack_d9e0;
                                          uStack_e118 = uStack_d9d8;
                                          uStack_e110 = uStack_d9d0;
                                          uStack_e108 = uStack_d9c8;
                                          auVar103._8_8_ = uStack_e938;
                                          auVar103._0_8_ = local_e940;
                                          auVar103._16_8_ = uStack_e930;
                                          auVar103._24_8_ = uStack_e928;
                                          auVar103._32_8_ = uStack_e920;
                                          auVar103._40_8_ = uStack_e918;
                                          auVar103._48_8_ = uStack_e910;
                                          auVar103._56_8_ = uStack_e908;
                                          local_e180 = local_e900;
                                          uStack_e178 = uStack_e8f8;
                                          uStack_e170 = uStack_e8f0;
                                          uStack_e168 = uStack_e8e8;
                                          uStack_e160 = uStack_e8e0;
                                          uStack_e158 = uStack_e8d8;
                                          uStack_e150 = uStack_e8d0;
                                          uStack_e148 = uStack_e8c8;
                                          local_e200 = local_d9c0;
                                          uStack_e1f8 = uStack_d9b8;
                                          uStack_e1f0 = uStack_d9b0;
                                          uStack_e1e8 = uStack_d9a8;
                                          uStack_e1e0 = uStack_d9a0;
                                          uStack_e1d8 = uStack_d998;
                                          uStack_e1d0 = uStack_d990;
                                          uStack_e1c8 = uStack_d988;
                                          local_e1c0 = local_e8c0;
                                          uStack_e1b8 = uStack_e8b8;
                                          uStack_e1b0 = uStack_e8b0;
                                          uStack_e1a8 = uStack_e8a8;
                                          uStack_e1a0 = uStack_e8a0;
                                          uStack_e198 = uStack_e898;
                                          uStack_e190 = uStack_e890;
                                          uStack_e188 = uStack_e888;
                                          local_e2c0 = local_d980;
                                          uStack_e2b8 = uStack_d978;
                                          uStack_e2b0 = uStack_d970;
                                          uStack_e2a8 = uStack_d968;
                                          uStack_e2a0 = uStack_d960;
                                          uStack_e298 = uStack_d958;
                                          uStack_e290 = uStack_d950;
                                          uStack_e288 = uStack_d948;
                                          local_e280 = local_e880;
                                          uStack_e278 = uStack_e878;
                                          uStack_e270 = uStack_e870;
                                          uStack_e268 = uStack_e868;
                                          uStack_e260 = uStack_e860;
                                          uStack_e258 = uStack_e858;
                                          uStack_e250 = uStack_e850;
                                          uStack_e248 = uStack_e848;
                                          local_e300 = local_d940;
                                          uStack_e2f8 = uStack_d938;
                                          uStack_e2f0 = uStack_d930;
                                          uStack_e2e8 = uStack_d928;
                                          uStack_e2e0 = uStack_d920;
                                          uStack_e2d8 = uStack_d918;
                                          uStack_e2d0 = uStack_d910;
                                          uStack_e2c8 = uStack_d908;
                                          local_e240 = local_e840;
                                          uStack_e238 = uStack_e838;
                                          uStack_e230 = uStack_e830;
                                          uStack_e228 = uStack_e828;
                                          uStack_e220 = uStack_e820;
                                          uStack_e218 = uStack_e818;
                                          uStack_e210 = uStack_e810;
                                          uStack_e208 = uStack_e808;
                                          local_e340 = local_dd00;
                                          puStack_e338 = puStack_dcf8;
                                          uStack_e330 = uStack_dcf0;
                                          uStack_e328 = uStack_dce8;
                                          uStack_e320 = uStack_dce0;
                                          uStack_e318 = uStack_dcd8;
                                          uStack_e310 = uStack_dcd0;
                                          uStack_e308 = uStack_dcc8;
                                          local_e380 = local_dcc0;
                                          uStack_e378 = uStack_dcb8;
                                          uStack_e370 = uStack_dcb0;
                                          uStack_e368 = uStack_dca8;
                                          uStack_e360 = uStack_dca0;
                                          uStack_e358 = uStack_dc98;
                                          uStack_e350 = uStack_dc90;
                                          uStack_e348 = uStack_dc88;
                                          local_e3c0 = local_dc80;
                                          uStack_e3b8 = uStack_dc78;
                                          uStack_e3b0 = uStack_dc70;
                                          uStack_e3a8 = uStack_dc68;
                                          uStack_e3a0 = uStack_dc60;
                                          uStack_e398 = uStack_dc58;
                                          uStack_e390 = uStack_dc50;
                                          uStack_e388 = uStack_dc48;
                                          local_e400 = local_dc40;
                                          uStack_e3f8 = uStack_dc38;
                                          uStack_e3f0 = uStack_dc30;
                                          uStack_e3e8 = uStack_dc28;
                                          uStack_e3e0 = uStack_dc20;
                                          uStack_e3d8 = uStack_dc18;
                                          uStack_e3d0 = uStack_dc10;
                                          uStack_e3c8 = uStack_dc08;
                                          local_e440 = local_dc00;
                                          uStack_e438 = uStack_dbf8;
                                          uStack_e430 = uStack_dbf0;
                                          uStack_e428 = uStack_dbe8;
                                          uStack_e420 = uStack_dbe0;
                                          uStack_e418 = uStack_dbd8;
                                          uStack_e410 = uStack_dbd0;
                                          uStack_e408 = uStack_dbc8;
                                          local_e480 = local_dbc0;
                                          uStack_e478 = uStack_dbb8;
                                          uStack_e470 = uStack_dbb0;
                                          uStack_e468 = uStack_dba8;
                                          uStack_e460 = uStack_dba0;
                                          uStack_e458 = uStack_db98;
                                          uStack_e450 = uStack_db90;
                                          uStack_e448 = uStack_db88;
                                          local_e4c0 = local_db80;
                                          uStack_e4b8 = uStack_db78;
                                          uStack_e4b0 = uStack_db70;
                                          uStack_e4a8 = uStack_db68;
                                          uStack_e4a0 = uStack_db60;
                                          uStack_e498 = uStack_db58;
                                          uStack_e490 = uStack_db50;
                                          uStack_e488 = uStack_db48;
                                          local_e500 = local_db40;
                                          uStack_e4f8 = uStack_db38;
                                          uStack_e4f0 = uStack_db30;
                                          uStack_e4e8 = uStack_db28;
                                          uStack_e4e0 = uStack_db20;
                                          uStack_e4d8 = uStack_db18;
                                          uStack_e4d0 = uStack_db10;
                                          uStack_e4c8 = uStack_db08;
                                          auVar99 = local_eb00;
                                          auVar100 = local_ea40;
                                          auVar101 = local_eac0;
                                          auVar105 = local_ea80;
                                          while ((~((long)uVar51 >> 0x3f) & uVar51) != uVar93) {
                                            auVar120._8_8_ = puStack_edf8;
                                            auVar120._0_8_ = local_ee00;
                                            auVar120._16_8_ = dStack_edf0;
                                            auVar120._24_8_ = dStack_ede8;
                                            auVar120._32_8_ = dStack_ede0;
                                            auVar120._40_8_ = dStack_edd8;
                                            auVar120._48_8_ = dStack_edd0;
                                            auVar120._56_8_ = dStack_edc8;
                                            auVar112._8_8_ = dStack_edb8;
                                            auVar112._0_8_ = local_edc0;
                                            auVar112._16_8_ = dStack_edb0;
                                            auVar112._24_8_ = dStack_eda8;
                                            auVar112._32_8_ = dStack_eda0;
                                            auVar112._40_8_ = dStack_ed98;
                                            auVar112._48_8_ = dStack_ed90;
                                            auVar112._56_8_ = dStack_ed88;
                                            auVar111._8_8_ = dStack_ed78;
                                            auVar111._0_8_ = local_ed80;
                                            auVar111._16_8_ = dStack_ed70;
                                            auVar111._24_8_ = dStack_ed68;
                                            auVar111._32_8_ = dStack_ed60;
                                            auVar111._40_8_ = dStack_ed58;
                                            auVar111._48_8_ = dStack_ed50;
                                            auVar111._56_8_ = dStack_ed48;
                                            auVar110._8_8_ = dStack_ed38;
                                            auVar110._0_8_ = local_ed40;
                                            auVar110._16_8_ = dStack_ed30;
                                            auVar110._24_8_ = dStack_ed28;
                                            auVar110._32_8_ = dStack_ed20;
                                            auVar110._40_8_ = dStack_ed18;
                                            auVar110._48_8_ = dStack_ed10;
                                            auVar110._56_8_ = dStack_ed08;
                                            auVar109._8_8_ = dStack_ecf8;
                                            auVar109._0_8_ = local_ed00;
                                            auVar109._16_8_ = dStack_ecf0;
                                            auVar109._24_8_ = dStack_ece8;
                                            auVar109._32_8_ = dStack_ece0;
                                            auVar109._40_8_ = dStack_ecd8;
                                            auVar109._48_8_ = dStack_ecd0;
                                            auVar109._56_8_ = dStack_ecc8;
                                            auVar108._8_8_ = dStack_ecb8;
                                            auVar108._0_8_ = local_ecc0;
                                            auVar108._16_8_ = dStack_ecb0;
                                            auVar108._24_8_ = dStack_eca8;
                                            auVar108._32_8_ = dStack_eca0;
                                            auVar108._40_8_ = dStack_ec98;
                                            auVar108._48_8_ = dStack_ec90;
                                            auVar108._56_8_ = dStack_ec88;
                                            auVar107._8_8_ = dStack_ec78;
                                            auVar107._0_8_ = local_ec80;
                                            auVar107._16_8_ = dStack_ec70;
                                            auVar107._24_8_ = dStack_ec68;
                                            auVar107._32_8_ = dStack_ec60;
                                            auVar107._40_8_ = dStack_ec58;
                                            auVar107._48_8_ = dStack_ec50;
                                            auVar107._56_8_ = dStack_ec48;
                                            auVar106._8_8_ = dStack_ec38;
                                            auVar106._0_8_ = local_ec40;
                                            auVar106._16_8_ = dStack_ec30;
                                            auVar106._24_8_ = dStack_ec28;
                                            auVar106._32_8_ = dStack_ec20;
                                            auVar106._40_8_ = dStack_ec18;
                                            auVar106._48_8_ = dStack_ec10;
                                            auVar106._56_8_ = dStack_ec08;
                                            if ((uVar85 < 0x80) || (uVar85 < 0xc0)) break;
                                            auVar119._8_8_ = uStack_d8f8;
                                            auVar119._0_8_ = local_d900;
                                            auVar119._16_8_ = uStack_d8f0;
                                            auVar119._24_8_ = uStack_d8e8;
                                            auVar119._32_8_ = uStack_d8e0;
                                            auVar119._40_8_ = uStack_d8d8;
                                            auVar119._48_8_ = uStack_d8d0;
                                            auVar119._56_8_ = uStack_d8c8;
                                            auVar113 = vmulpd_avx512f(auVar120,pauVar82[8]);
                                            auVar114 = vmulpd_avx512f(auVar102,pauVar82[0x10]);
                                            auVar115 = vmulpd_avx512f(auVar119,*pauVar82);
                                            auVar113 = vaddpd_avx512f(auVar115,auVar113);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar114);
                                            pauVar88[-0x17] = auVar113;
                                            auVar118._8_8_ = uStack_d8b8;
                                            auVar118._0_8_ = local_d8c0;
                                            auVar118._16_8_ = uStack_d8b0;
                                            auVar118._24_8_ = uStack_d8a8;
                                            auVar118._32_8_ = uStack_d8a0;
                                            auVar118._40_8_ = uStack_d898;
                                            auVar118._48_8_ = uStack_d890;
                                            auVar118._56_8_ = uStack_d888;
                                            auVar113 = vmulpd_avx512f(auVar118,pauVar82[1]);
                                            auVar114 = vmulpd_avx512f(auVar112,pauVar82[9]);
                                            auVar115 = vmulpd_avx512f(local_ebc0,pauVar82[0x11]);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar114);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar115);
                                            pauVar88[-0x16] = auVar113;
                                            auVar117._8_8_ = uStack_d878;
                                            auVar117._0_8_ = local_d880;
                                            auVar117._16_8_ = uStack_d870;
                                            auVar117._24_8_ = uStack_d868;
                                            auVar117._32_8_ = uStack_d860;
                                            auVar117._40_8_ = uStack_d858;
                                            auVar117._48_8_ = uStack_d850;
                                            auVar117._56_8_ = uStack_d848;
                                            auVar113 = vmulpd_avx512f(auVar117,pauVar82[2]);
                                            auVar114 = vmulpd_avx512f(auVar111,pauVar82[10]);
                                            auVar115 = vmulpd_avx512f(local_eb80,pauVar82[0x12]);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar114);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar115);
                                            pauVar88[-0x15] = auVar113;
                                            auVar116._8_8_ = uStack_d838;
                                            auVar116._0_8_ = local_d840;
                                            auVar116._16_8_ = uStack_d830;
                                            auVar116._24_8_ = uStack_d828;
                                            auVar116._32_8_ = uStack_d820;
                                            auVar116._40_8_ = uStack_d818;
                                            auVar116._48_8_ = uStack_d810;
                                            auVar116._56_8_ = uStack_d808;
                                            auVar113 = vmulpd_avx512f(auVar116,pauVar82[3]);
                                            auVar114 = vmulpd_avx512f(auVar110,pauVar82[0xb]);
                                            auVar115 = vmulpd_avx512f(local_eb40,pauVar82[0x13]);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar114);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar115);
                                            pauVar88[-0x14] = auVar113;
                                            auVar115._8_8_ = uStack_d7f8;
                                            auVar115._0_8_ = local_d800;
                                            auVar115._16_8_ = uStack_d7f0;
                                            auVar115._24_8_ = uStack_d7e8;
                                            auVar115._32_8_ = uStack_d7e0;
                                            auVar115._40_8_ = uStack_d7d8;
                                            auVar115._48_8_ = uStack_d7d0;
                                            auVar115._56_8_ = uStack_d7c8;
                                            auVar113 = vmulpd_avx512f(auVar115,pauVar82[4]);
                                            auVar114 = vmulpd_avx512f(auVar109,pauVar82[0xc]);
                                            auVar99 = vmulpd_avx512f(auVar99,pauVar82[0x14]);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar114);
                                            auVar99 = vaddpd_avx512f(auVar113,auVar99);
                                            pauVar88[-0x13] = auVar99;
                                            auVar114._8_8_ = uStack_d7b8;
                                            auVar114._0_8_ = local_d7c0;
                                            auVar114._16_8_ = uStack_d7b0;
                                            auVar114._24_8_ = uStack_d7a8;
                                            auVar114._32_8_ = uStack_d7a0;
                                            auVar114._40_8_ = uStack_d798;
                                            auVar114._48_8_ = uStack_d790;
                                            auVar114._56_8_ = uStack_d788;
                                            auVar99 = vmulpd_avx512f(auVar114,pauVar82[5]);
                                            auVar113 = vmulpd_avx512f(auVar108,pauVar82[0xd]);
                                            auVar101 = vmulpd_avx512f(auVar101,pauVar82[0x15]);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar113);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                            pauVar88[-0x12] = auVar99;
                                            auVar113._8_8_ = uStack_d778;
                                            auVar113._0_8_ = local_d780;
                                            auVar113._16_8_ = uStack_d770;
                                            auVar113._24_8_ = uStack_d768;
                                            auVar113._32_8_ = uStack_d760;
                                            auVar113._40_8_ = uStack_d758;
                                            auVar113._48_8_ = uStack_d750;
                                            auVar113._56_8_ = uStack_d748;
                                            auVar99 = vmulpd_avx512f(auVar113,pauVar82[6]);
                                            auVar101 = vmulpd_avx512f(auVar107,pauVar82[0xe]);
                                            auVar105 = vmulpd_avx512f(auVar105,pauVar82[0x16]);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar105);
                                            pauVar88[-0x11] = auVar99;
                                            auVar105._8_8_ = uStack_d738;
                                            auVar105._0_8_ = local_d740;
                                            auVar105._16_8_ = uStack_d730;
                                            auVar105._24_8_ = uStack_d728;
                                            auVar105._32_8_ = uStack_d720;
                                            auVar105._40_8_ = uStack_d718;
                                            auVar105._48_8_ = uStack_d710;
                                            auVar105._56_8_ = uStack_d708;
                                            auVar99 = vmulpd_avx512f(auVar105,pauVar82[7]);
                                            auVar101 = vmulpd_avx512f(auVar106,pauVar82[0xf]);
                                            auVar100 = vmulpd_avx512f(auVar100,pauVar82[0x17]);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                            pauVar88[-0x10] = auVar99;
                                            if ((long)uVar51 <= (long)uVar93) break;
                                            auStack_13040 = pauVar82[8];
                                            auVar99 = vmulpd_avx512f(auVar120,*pauVar82);
                                            auStack_13140 = pauVar82[0x10];
                                            auVar72._8_8_ = puStack_e9f8;
                                            auVar72._0_8_ = local_ea00;
                                            auVar72._16_8_ = uStack_e9f0;
                                            auVar72._24_8_ = uStack_e9e8;
                                            auVar72._32_8_ = uStack_e9e0;
                                            auVar72._40_8_ = uStack_e9d8;
                                            auVar72._48_8_ = uStack_e9d0;
                                            auVar72._56_8_ = uStack_e9c8;
                                            auVar68._8_8_ = uStack_e8b8;
                                            auVar68._0_8_ = local_e8c0;
                                            auVar68._16_8_ = uStack_e8b0;
                                            auVar68._24_8_ = uStack_e8a8;
                                            auVar68._32_8_ = uStack_e8a0;
                                            auVar68._40_8_ = uStack_e898;
                                            auVar68._48_8_ = uStack_e890;
                                            auVar68._56_8_ = uStack_e888;
                                            auVar65._8_8_ = uStack_e878;
                                            auVar65._0_8_ = local_e880;
                                            auVar65._16_8_ = uStack_e870;
                                            auVar65._24_8_ = uStack_e868;
                                            auVar65._32_8_ = uStack_e860;
                                            auVar65._40_8_ = uStack_e858;
                                            auVar65._48_8_ = uStack_e850;
                                            auVar65._56_8_ = uStack_e848;
                                            uVar93 = uVar93 + 1;
                                            auVar76._8_8_ = puStack_daf8;
                                            auVar76._0_8_ = local_db00;
                                            auVar76._16_8_ = uStack_daf0;
                                            auVar76._24_8_ = uStack_dae8;
                                            auVar76._32_8_ = uStack_dae0;
                                            auVar76._40_8_ = uStack_dad8;
                                            auVar76._48_8_ = uStack_dad0;
                                            auVar76._56_8_ = uStack_dac8;
                                            auVar100 = vmulpd_avx512f(auStack_13040,auVar76);
                                            auVar101 = vmulpd_avx512f(auVar72,auStack_13140);
                                            auVar115 = vmulpd_avx512f(auVar72,auStack_13040);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                            pauVar88[-0xf] = auVar99;
                                            auStack_130c0 = pauVar82[9];
                                            auStack_13080 = pauVar82[1];
                                            auVar75._8_8_ = uStack_dab8;
                                            auVar75._0_8_ = local_dac0;
                                            auVar75._16_8_ = uStack_dab0;
                                            auVar75._24_8_ = uStack_daa8;
                                            auVar75._32_8_ = uStack_daa0;
                                            auVar75._40_8_ = uStack_da98;
                                            auVar75._48_8_ = uStack_da90;
                                            auVar75._56_8_ = uStack_da88;
                                            auVar99 = vmulpd_avx512f(auStack_130c0,auVar75);
                                            auVar100 = vmulpd_avx512f(auVar112,auStack_13080);
                                            auStack_13100 = pauVar82[0x11];
                                            auVar99 = vaddpd_avx512f(auVar100,auVar99);
                                            auVar71._8_8_ = uStack_e9b8;
                                            auVar71._0_8_ = local_e9c0;
                                            auVar71._16_8_ = uStack_e9b0;
                                            auVar71._24_8_ = uStack_e9a8;
                                            auVar71._32_8_ = uStack_e9a0;
                                            auVar71._40_8_ = uStack_e998;
                                            auVar71._48_8_ = uStack_e990;
                                            auVar71._56_8_ = uStack_e988;
                                            auVar100 = vmulpd_avx512f(auVar71,auStack_13100);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                            pauVar88[-0xe] = auVar99;
                                            auVar74._8_8_ = uStack_da78;
                                            auVar74._0_8_ = local_da80;
                                            auVar74._16_8_ = uStack_da70;
                                            auVar74._24_8_ = uStack_da68;
                                            auVar74._32_8_ = uStack_da60;
                                            auVar74._40_8_ = uStack_da58;
                                            auVar74._48_8_ = uStack_da50;
                                            auVar74._56_8_ = uStack_da48;
                                            auVar99 = vmulpd_avx512f(pauVar82[10],auVar74);
                                            auVar100 = vmulpd_avx512f(auVar111,pauVar82[2]);
                                            auVar116 = vmulpd_avx512f(local_eb80,pauVar82[2]);
                                            auVar117 = vmulpd_avx512f(auVar104,pauVar82[10]);
                                            auVar99 = vaddpd_avx512f(auVar100,auVar99);
                                            auVar100 = vmulpd_avx512f(auVar104,pauVar82[0x12]);
                                            auVar60._8_8_ = uStack_dc78;
                                            auVar60._0_8_ = local_dc80;
                                            auVar60._16_8_ = uStack_dc70;
                                            auVar60._24_8_ = uStack_dc68;
                                            auVar60._32_8_ = uStack_dc60;
                                            auVar60._40_8_ = uStack_dc58;
                                            auVar60._48_8_ = uStack_dc50;
                                            auVar60._56_8_ = uStack_dc48;
                                            auVar118 = vmulpd_avx512f(pauVar82[0x12],auVar60);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                            pauVar88[-0xd] = auVar99;
                                            auVar69._8_8_ = uStack_e8f8;
                                            auVar69._0_8_ = local_e900;
                                            auVar69._16_8_ = uStack_e8f0;
                                            auVar69._24_8_ = uStack_e8e8;
                                            auVar69._32_8_ = uStack_e8e0;
                                            auVar69._40_8_ = uStack_e8d8;
                                            auVar69._48_8_ = uStack_e8d0;
                                            auVar69._56_8_ = uStack_e8c8;
                                            auVar99 = pauVar82[0xb];
                                            auVar73._8_8_ = uStack_da38;
                                            auVar73._0_8_ = local_da40;
                                            auVar73._16_8_ = uStack_da30;
                                            auVar73._24_8_ = uStack_da28;
                                            auVar73._32_8_ = uStack_da20;
                                            auVar73._40_8_ = uStack_da18;
                                            auVar73._48_8_ = uStack_da10;
                                            auVar73._56_8_ = uStack_da08;
                                            auVar101 = vmulpd_avx512f(auVar99,auVar73);
                                            auVar105 = vmulpd_avx512f(auVar110,pauVar82[3]);
                                            auVar100 = pauVar82[0x13];
                                            auVar119 = vmulpd_avx512f(local_eb40,pauVar82[3]);
                                            auVar101 = vaddpd_avx512f(auVar105,auVar101);
                                            auVar105 = vmulpd_avx512f(auVar103,auVar100);
                                            auVar101 = vaddpd_avx512f(auVar101,auVar105);
                                            pauVar88[-0xc] = auVar101;
                                            auVar101 = pauVar82[4];
                                            auVar105 = pauVar82[0xc];
                                            auVar70._8_8_ = uStack_d9f8;
                                            auVar70._0_8_ = local_da00;
                                            auVar70._16_8_ = uStack_d9f0;
                                            auVar70._24_8_ = uStack_d9e8;
                                            auVar70._32_8_ = uStack_d9e0;
                                            auVar70._40_8_ = uStack_d9d8;
                                            auVar70._48_8_ = uStack_d9d0;
                                            auVar70._56_8_ = uStack_d9c8;
                                            auVar110 = vmulpd_avx512f(auVar105,auVar70);
                                            auVar111 = vmulpd_avx512f(auVar109,auVar101);
                                            auVar109 = pauVar82[0x14];
                                            auVar110 = vaddpd_avx512f(auVar111,auVar110);
                                            auVar66._8_8_ = uStack_e838;
                                            auVar66._0_8_ = local_e840;
                                            auVar66._16_8_ = uStack_e830;
                                            auVar66._24_8_ = uStack_e828;
                                            auVar66._32_8_ = uStack_e820;
                                            auVar66._40_8_ = uStack_e818;
                                            auVar66._48_8_ = uStack_e810;
                                            auVar66._56_8_ = uStack_e808;
                                            auVar111 = vmulpd_avx512f(auVar69,auVar109);
                                            auVar110 = vaddpd_avx512f(auVar110,auVar111);
                                            pauVar88[-0xb] = auVar110;
                                            auVar110 = pauVar82[5];
                                            auVar111 = pauVar82[0xd];
                                            auVar67._8_8_ = uStack_d9b8;
                                            auVar67._0_8_ = local_d9c0;
                                            auVar67._16_8_ = uStack_d9b0;
                                            auVar67._24_8_ = uStack_d9a8;
                                            auVar67._32_8_ = uStack_d9a0;
                                            auVar67._40_8_ = uStack_d998;
                                            auVar67._48_8_ = uStack_d990;
                                            auVar67._56_8_ = uStack_d988;
                                            auVar112 = vmulpd_avx512f(auVar111,auVar67);
                                            auVar108 = vmulpd_avx512f(auVar108,auVar110);
                                            auVar112 = vaddpd_avx512f(auVar108,auVar112);
                                            auVar108 = pauVar82[0x15];
                                            auVar120 = vmulpd_avx512f(auVar68,auVar108);
                                            auVar112 = vaddpd_avx512f(auVar112,auVar120);
                                            pauVar88[-10] = auVar112;
                                            auVar112 = pauVar82[6];
                                            auVar120 = pauVar82[0xe];
                                            auVar64._8_8_ = uStack_d978;
                                            auVar64._0_8_ = local_d980;
                                            auVar64._16_8_ = uStack_d970;
                                            auVar64._24_8_ = uStack_d968;
                                            auVar64._32_8_ = uStack_d960;
                                            auVar64._40_8_ = uStack_d958;
                                            auVar64._48_8_ = uStack_d950;
                                            auVar64._56_8_ = uStack_d948;
                                            auVar113 = vmulpd_avx512f(auVar120,auVar64);
                                            auVar107 = vmulpd_avx512f(auVar107,auVar112);
                                            auVar113 = vaddpd_avx512f(auVar107,auVar113);
                                            auVar107 = pauVar82[0x16];
                                            auVar114 = vmulpd_avx512f(auVar65,auVar107);
                                            auVar113 = vaddpd_avx512f(auVar113,auVar114);
                                            pauVar88[-9] = auVar113;
                                            auVar113 = pauVar82[7];
                                            auVar114 = pauVar82[0xf];
                                            auVar63._8_8_ = uStack_d938;
                                            auVar63._0_8_ = local_d940;
                                            auVar63._16_8_ = uStack_d930;
                                            auVar63._24_8_ = uStack_d928;
                                            auVar63._32_8_ = uStack_d920;
                                            auVar63._40_8_ = uStack_d918;
                                            auVar63._48_8_ = uStack_d910;
                                            auVar63._56_8_ = uStack_d908;
                                            auVar121 = vmulpd_avx512f(auVar114,auVar63);
                                            auVar106 = vmulpd_avx512f(auVar106,auVar113);
                                            auVar121 = vaddpd_avx512f(auVar106,auVar121);
                                            auVar106 = pauVar82[0x17];
                                            auVar122 = vmulpd_avx512f(auVar66,auVar106);
                                            auVar121 = vaddpd_avx512f(auVar121,auVar122);
                                            pauVar88[-8] = auVar121;
                                            auVar121 = vmulpd_avx512f(auVar102,*pauVar82);
                                            pauVar82 = (undefined1 (*) [64])(*pauVar82 + uVar85 * 8)
                                            ;
                                            auVar62._8_8_ = puStack_dcf8;
                                            auVar62._0_8_ = local_dd00;
                                            auVar62._16_8_ = uStack_dcf0;
                                            auVar62._24_8_ = uStack_dce8;
                                            auVar62._32_8_ = uStack_dce0;
                                            auVar62._40_8_ = uStack_dcd8;
                                            auVar62._48_8_ = uStack_dcd0;
                                            auVar62._56_8_ = uStack_dcc8;
                                            auVar122 = vmulpd_avx512f(auStack_13140,auVar62);
                                            auVar115 = vaddpd_avx512f(auVar121,auVar115);
                                            auVar121 = vmulpd_avx512f(local_ebc0,auStack_13080);
                                            auVar115 = vaddpd_avx512f(auVar115,auVar122);
                                            auVar122 = vmulpd_avx512f(auVar71,auStack_130c0);
                                            auVar61._8_8_ = uStack_dcb8;
                                            auVar61._0_8_ = local_dcc0;
                                            auVar61._16_8_ = uStack_dcb0;
                                            auVar61._24_8_ = uStack_dca8;
                                            auVar61._32_8_ = uStack_dca0;
                                            auVar61._40_8_ = uStack_dc98;
                                            auVar61._48_8_ = uStack_dc90;
                                            auVar61._56_8_ = uStack_dc88;
                                            auVar123 = vmulpd_avx512f(auStack_13100,auVar61);
                                            pauVar88[-7] = auVar115;
                                            auVar115 = vaddpd_avx512f(auVar121,auVar122);
                                            auVar115 = vaddpd_avx512f(auVar115,auVar123);
                                            pauVar88[-6] = auVar115;
                                            auVar115 = vaddpd_avx512f(auVar116,auVar117);
                                            auVar99 = vmulpd_avx512f(auVar103,auVar99);
                                            auVar59._8_8_ = uStack_dc38;
                                            auVar59._0_8_ = local_dc40;
                                            auVar59._16_8_ = uStack_dc30;
                                            auVar59._24_8_ = uStack_dc28;
                                            auVar59._32_8_ = uStack_dc20;
                                            auVar59._40_8_ = uStack_dc18;
                                            auVar59._48_8_ = uStack_dc10;
                                            auVar59._56_8_ = uStack_dc08;
                                            auVar100 = vmulpd_avx512f(auVar100,auVar59);
                                            auVar115 = vaddpd_avx512f(auVar115,auVar118);
                                            pauVar88[-5] = auVar115;
                                            auVar99 = vaddpd_avx512f(auVar119,auVar99);
                                            auVar105 = vmulpd_avx512f(auVar69,auVar105);
                                            auVar58._8_8_ = uStack_dbf8;
                                            auVar58._0_8_ = local_dc00;
                                            auVar58._16_8_ = uStack_dbf0;
                                            auVar58._24_8_ = uStack_dbe8;
                                            auVar58._32_8_ = uStack_dbe0;
                                            auVar58._40_8_ = uStack_dbd8;
                                            auVar58._48_8_ = uStack_dbd0;
                                            auVar58._56_8_ = uStack_dbc8;
                                            auVar109 = vmulpd_avx512f(auVar109,auVar58);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                            pauVar88[-4] = auVar99;
                                            auVar99 = vmulpd_avx512f(local_eb00,auVar101);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar105);
                                            auVar123._8_8_ = uStack_dbb8;
                                            auVar123._0_8_ = local_dbc0;
                                            auVar123._16_8_ = uStack_dbb0;
                                            auVar123._24_8_ = uStack_dba8;
                                            auVar123._32_8_ = uStack_dba0;
                                            auVar123._40_8_ = uStack_db98;
                                            auVar123._48_8_ = uStack_db90;
                                            auVar123._56_8_ = uStack_db88;
                                            auVar100 = vmulpd_avx512f(auVar108,auVar123);
                                            auVar101 = vmulpd_avx512f(auVar68,auVar111);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar109);
                                            pauVar88[-3] = auVar99;
                                            auVar99 = vmulpd_avx512f(local_eac0,auVar110);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                            auVar101 = vmulpd_avx512f(auVar65,auVar120);
                                            auVar122._8_8_ = uStack_db78;
                                            auVar122._0_8_ = local_db80;
                                            auVar122._16_8_ = uStack_db70;
                                            auVar122._24_8_ = uStack_db68;
                                            auVar122._32_8_ = uStack_db60;
                                            auVar122._40_8_ = uStack_db58;
                                            auVar122._48_8_ = uStack_db50;
                                            auVar122._56_8_ = uStack_db48;
                                            auVar105 = vmulpd_avx512f(auVar107,auVar122);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar100);
                                            auVar100 = vmulpd_avx512f(local_ea80,auVar112);
                                            pauVar88[-2] = auVar99;
                                            auVar99 = vaddpd_avx512f(auVar100,auVar101);
                                            auVar100 = vmulpd_avx512f(auVar66,auVar114);
                                            auVar121._8_8_ = uStack_db38;
                                            auVar121._0_8_ = local_db40;
                                            auVar121._16_8_ = uStack_db30;
                                            auVar121._24_8_ = uStack_db28;
                                            auVar121._32_8_ = uStack_db20;
                                            auVar121._40_8_ = uStack_db18;
                                            auVar121._48_8_ = uStack_db10;
                                            auVar121._56_8_ = uStack_db08;
                                            auVar101 = vmulpd_avx512f(auVar106,auVar121);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar105);
                                            auVar105 = vmulpd_avx512f(local_ea40,auVar113);
                                            pauVar88[-1] = auVar99;
                                            auVar99 = vaddpd_avx512f(auVar105,auVar100);
                                            auVar99 = vaddpd_avx512f(auVar99,auVar101);
                                            *pauVar88 = auVar99;
                                            pauVar88 = pauVar88 + 0x18;
                                            auVar99 = local_e540;
                                            auVar100 = local_e600;
                                            auVar101 = local_e580;
                                            auVar105 = local_e5c0;
                                            if (uVar93 == 0x20) {
                                              uVar85 = 0xfffffffffffffff8;
                                              auVar48._8_8_ = 0;
                                              auVar48._0_8_ = dStack_13358;
                                              auVar99 = vbroadcastsd_avx512f(auVar48);
                                              do {
                                                auVar100 = vmulpd_avx512f(auVar99,*(undefined1
                                                                                    (*) [64])
                                                                                   ((this->
                                                  m_MassMatrix).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>_>
                                                  .m_storage.m_data.array + uVar85 + 8));
                                                *(undefined1 (*) [64])(auStack_d6c0 + uVar85 * 8) =
                                                     auVar100;
                                                uVar85 = uVar85 + 8;
                                              } while (uVar85 < 0x208);
                                              pdStack_12e00 =
                                                   (this->m_SD).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_data;
                                              lVar79 = (this->m_SD).
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_cols;
                                              dVar89 = 1.58101006669199e-322;
                                              pdVar95 = local_c5c0;
                                              pCStack_12d00 = this;
                                              auVar77._56_8_ = 0;
                                              auVar77._0_56_ = auStack_13100._8_56_;
                                              auStack_13100 = auVar77 << 0x40;
                                              lVar81 = 0;
                                              bStack_12cc0 = -1 < lVar79 ||
                                                             pdStack_12e00 == (double *)0x0;
                                              do {
                                                pdVar52 = (H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data;
                                                lVar53 = (H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value;
                                                lVar54 = (H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).m_stride.m_outer.m_value;
                                                lVar56 = lVar81 * 3;
                                                lVar91 = lVar81 * 3 + 1;
                                                dStack_12d80 = dVar89;
                                                pdStack_12dc0 = pdVar95;
                                                auStack_13040._0_8_ = lVar91;
                                                auStack_13140._0_8_ = lVar56;
                                                pauStack_12c40 =
                                                     (undefined1 (*) [64])
                                                     (pdStack_12e00 + lVar79 * lVar81);
                                                pdVar86 = pdVar52 + lVar81 * 3;
                                                lVar87 = lVar81 * 3 + 2;
                                                auStack_130c0._0_8_ = pdVar86;
                                                auStack_13080._0_8_ = lVar87;
                                                pdStack_12d40 = pdVar52 + lVar54 * lVar91;
                                                dVar84 = (double)(ulong)(uint)auStack_13100._0_4_;
                                                dVar3 = (double)((long)dVar89 + (long)dVar84);
                                                dStack_12c80 = 2.60866661004178e-321;
                                                if (0x210 < (ulong)dVar84) {
                                                  dStack_12c80 = dVar84;
                                                }
                                                auStack_13100._0_8_ = dVar3;
                                                lVar90 = lVar81;
                                                pdVar96 = pdVar95;
                                                do {
                                                  if (-1 >= lVar79 && pdStack_12e00 != (double *)0x0
                                                     ) {
                                                    __assert_fail(
                                                  "(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",
                                                  0xb2,
                                                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
                                                  );
                                                  }
                                                  if ((this->m_SD).
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_rows <= lVar81) {
                                                    __assert_fail(
                                                  "(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                                                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a
                                                  ,
                                                  "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                                                  );
                                                  }
                                                  if (lVar79 < 0) {
                                                    __assert_fail(
                                                  "rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                                  ,
                                                  "/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h"
                                                  ,0x4a,
                                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
                                                  );
                                                  }
                                                  if (lVar79 != 0xc0) {
                                                    pcVar83 = 
                                                  "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 32, 192, 1>, 1, 192, true>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 32, 192, 1>, 1, 192, true>>, Option = 0]"
                                                  ;
                                                  goto LAB_006f2b99;
                                                  }
                                                  auVar49._8_8_ = 0;
                                                  auVar49._0_8_ = dStack_13360;
                                                  auVar99 = vbroadcastsd_avx512f(auVar49);
                                                  auVar100 = vmulpd_avx512f(auVar99,*pauStack_12c40)
                                                  ;
                                                  auVar101 = vmulpd_avx512f(auVar99,pauStack_12c40
                                                                                    [1]);
                                                  auVar100 = vmulpd_avx512f(auVar100,*(undefined1
                                                                                       (*) [64])
                                                                                      (&local_c680 +
                                                                                      lVar90 * 0xc0)
                                                                           );
                                                  auVar101 = vmulpd_avx512f(auVar101,*(undefined1
                                                                                       (*) [64])
                                                                                      (local_c640 +
                                                                                      lVar90 * 0xc0)
                                                                           );
                                                  uVar85 = 0xfffffffffffffff0;
                                                  do {
                                                    auVar102 = vmulpd_avx512f(auVar99,*(undefined1
                                                                                        (*) [64])
                                                                                       (
                                                  pauStack_12c40[4] + uVar85 * 8));
                                                  auVar103 = vmulpd_avx512f(auVar99,*(undefined1
                                                                                      (*) [64])
                                                                                     (pauStack_12c40
                                                                                      [5] + uVar85 *
                                                                                            8));
                                                  auVar102 = vmulpd_avx512f(auVar102,*(undefined1
                                                                                       (*) [64])
                                                                                      (pdVar96 +
                                                                                      uVar85 + 8));
                                                  auVar100 = vaddpd_avx512f(auVar100,auVar102);
                                                  auVar102 = vmulpd_avx512f(auVar103,*(undefined1
                                                                                       (*) [64])
                                                                                      (pdVar96 +
                                                                                      uVar85 + 0x10)
                                                                           );
                                                  uVar85 = uVar85 + 0x10;
                                                  auVar101 = vaddpd_avx512f(auVar101,auVar102);
                                                  } while (uVar85 < 0xa0);
                                                  if (dVar84 == dStack_12c80) {
                                                    __assert_fail("index >= 0 && index < size()",
                                                                                                                                    
                                                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h"
                                                  ,0x1ab,
                                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 528, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 528, 1>, Level = 1]"
                                                  );
                                                  }
                                                  if ((lVar53 <= lVar56) ||
                                                     (lVar57 = lVar90 * 3,
                                                     (H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar57)) {
LAB_006f2b40:
                                                    __assert_fail(
                                                  "row >= 0 && row < rows() && col >= 0 && col < cols()"
                                                  ,
                                                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h"
                                                  ,0x16f,
                                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                                                  );
                                                  }
                                                  auVar99 = vaddpd_avx512f(auVar100,auVar101);
                                                  auVar98 = vextractf64x4_avx512f(auVar99,1);
                                                  dVar55 = auVar99._0_8_ + auVar98._0_8_ +
                                                           auVar99._8_8_ + auVar98._8_8_ +
                                                           auVar99._16_8_ + auVar98._16_8_ +
                                                           auVar99._24_8_ + auVar98._24_8_ +
                                                           *(double *)
                                                            (local_d700 + (long)dVar84 * 8);
                                                  pdVar52[lVar54 * lVar56 + lVar90 * 3] =
                                                       dVar55 + pdVar52[lVar54 * lVar56 + lVar90 * 3
                                                                       ];
                                                  if ((lVar53 <= lVar91) ||
                                                     (((lVar1 = lVar57 + 1,
                                                       (H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar1 ||
                                                  (pdStack_12d40[lVar90 * 3 + 1] =
                                                        dVar55 + pdStack_12d40[lVar90 * 3 + 1],
                                                  lVar53 <= lVar87)) ||
                                                  (lVar2 = lVar57 + 2,
                                                  (H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar2)))) goto LAB_006f2b40;
                                                  pdVar52[lVar54 * lVar87 + lVar90 * 3 + 2] =
                                                       dVar55 + pdVar52[lVar54 * lVar87 +
                                                                        lVar90 * 3 + 2];
                                                  if (lVar81 != lVar90) {
                                                    if ((((lVar53 <= lVar57) ||
                                                         ((H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar56)) ||
                                                  ((pdVar86[lVar57 * lVar54] =
                                                         dVar55 + pdVar86[lVar57 * lVar54],
                                                   lVar53 <= lVar1 ||
                                                   (((H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar91 ||
                                                  (pdVar86[lVar1 * lVar54 + 1] =
                                                        dVar55 + pdVar86[lVar1 * lVar54 + 1],
                                                  lVar53 <= lVar2)))))) ||
                                                  ((H->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar87)) goto LAB_006f2b40;
                                                  pdVar86[lVar2 * lVar54 + 2] =
                                                       dVar55 + pdVar86[lVar2 * lVar54 + 2];
                                                  }
                                                  dVar84 = (double)((long)dVar84 + 1);
                                                  lVar90 = lVar90 + 1;
                                                  pdVar96 = pdVar96 + 0xc0;
                                                } while (dVar84 != dVar3);
                                                lVar81 = lVar81 + 1;
                                                dVar89 = (double)((long)dVar89 + -1);
                                                pdVar95 = pdVar95 + 0xc0;
                                                if (lVar81 == 0x20) {
                                                  if ((DenseStorage<double,__1,__1,__1,_1> *)
                                                      DStack_133c0.m_data !=
                                                      (DenseStorage<double,__1,__1,__1,_1> *)0x0) {
                                                    free((void *)((
                                                  DenseStorage<double,__1,__1,__1,_1> *)
                                                  ((long)DStack_133c0.m_data + -0x18))->m_cols);
                                                  }
                                                  if (DStack_133e0.m_data != (double *)0x0) {
                                                    free((void *)DStack_133e0.m_data[-1]);
                                                  }
                                                  if (DStack_13390.m_data != (double *)0x0) {
                                                    free((void *)DStack_13390.m_data[-1]);
                                                  }
                                                  return;
                                                }
                                              } while( true );
                                            }
                                          }
                                        }
LAB_006f2b62:
                                        pcVar83 = 
                                        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 64>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 64, InnerPanel = false]"
                                        ;
                                        goto LAB_006f2b77;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            pcVar83 = 
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 64, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
                            ;
                            goto LAB_006f2c5d;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pcVar83 = 
    "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 96, 64>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 96, BlockCols = 64, InnerPanel = false]"
    ;
LAB_006f2b77:
    __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar83);
  }
  pcVar83 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double, 192, 3, 0>, 64, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
  ;
LAB_006f2c5d:
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar83);
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalJacobianContIntDamping(ChMatrixRef& H,
                                                                   double Kfactor,
                                                                   double Rfactor,
                                                                   double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For this element, this is likely more efficient than the "Pre-Integration" style
    // calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
    // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
    // up the generalized internal force calculation while only having a minimal impact on the performance of the
    // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
    // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
    // and sparse component.

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ]
    // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
    //      [F13  F23  F33  F13dot  F23dot  F33dot ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    //==============================================================================
    //==============================================================================
    // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
    // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
    // time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
    //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
    //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
    //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
    //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
    //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
    // Note that each partial derivative block shown is placed to the left of the previous block.
    // The explanation of the calculation above is just too long to write it all on a single line.
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
    PE.resize(3 * NSF, 6 * NIP);

    for (auto i = 0; i < NSF; i++) {
        PE.block<1, NIP>(3 * i, 0 * NIP) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 1 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

        PE.block<1, NIP>((3 * i) + 1, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

        PE.block<1, NIP>((3 * i) + 2, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
    }

    // =============================================================================
    // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
    // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
    // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
    // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
    // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
    // indices of the components are in transposed order
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
    // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                               (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

    for (auto i = 0; i < 3; i++) {
        FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.array();
        FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.array();
        FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.array();
    }

    // =============================================================================
    // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
    // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
    // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
    // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
    // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
    // same time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
    Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

    for (auto i = 0; i < NSF; i++) {
        Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
    }

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
    // Gauss quadrature point
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
    DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
        D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
        D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
        D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
        D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
        D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
        D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

    // =============================================================================
    // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
    // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
    // =============================================================================

    H = PE * DScaled_Combined_PE.transpose();

    //==============================================================================
    //==============================================================================
    // Calculate the sparse and symmetric component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
    VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
    E1_Block.array() -= 1;
    E1_Block *= 0.5;
    E1_Block += m_Alpha * E_BlockDamping;
    E1_Block.array() *= m_kGQ.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
    VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E2_Block.array() -= 1;
    E2_Block *= 0.5;
    E2_Block += m_Alpha * E_BlockDamping;
    E2_Block.array() *= m_kGQ.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping.noalias() =
        FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
        FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
        FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E3_Block.array() -= 1;
    E3_Block *= 0.5;
    E3_Block += m_Alpha * E_BlockDamping;
    E3_Block.array() *= m_kGQ.array();

    // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
    //                  = kGQ*((F12*F13+F22*F23+F32*F33)
    //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E4_Block += m_Alpha * E_BlockDamping;
    E4_Block.array() *= m_kGQ.array();

    // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
    //                  = kGQ*((F11*F13+F21*F23+F31*F33)
    //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                               FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E5_Block += m_Alpha * E_BlockDamping;
    E5_Block.array() *= m_kGQ.array();

    // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
    //                  = kGQ*((F11*F12+F21*F22+F31*F32)
    //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                               FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
    VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E6_Block += m_Alpha * E_BlockDamping;
    E6_Block.array() *= m_kGQ.array();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                             D(0, 4) * E5_Block + D(0, 5) * E6_Block;
    VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                             D(1, 4) * E5_Block + D(1, 5) * E6_Block;
    VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                             D(2, 4) * E5_Block + D(2, 5) * E6_Block;
    VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                             D(3, 4) * E5_Block + D(3, 5) * E6_Block;
    VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                             D(4, 4) * E5_Block + D(4, 5) * E6_Block;
    VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                             D(5, 4) * E5_Block + D(5, 5) * E6_Block;

    // =============================================================================
    // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
    // quadrature point
    // =============================================================================

    ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

    for (auto i = 0; i < NSF; i++) {
        S_scaled_SD.template block<1, NIP>(i, 0) =
            SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));

        S_scaled_SD.template block<1, NIP>(i, NIP) =
            SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));

        S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
            SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));
    }

    // =============================================================================
    // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
    // matrix, combine this with the scaled mass matrix, and then expand them out to full size by summing the
    // contribution into the correct locations of the full sized Jacobian matrix
    // =============================================================================

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            double d = Kfactor * m_SD.row(i) * S_scaled_SD.row(j).transpose();
            d += ScaledMassMatrix(idx);

            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
            if (i != j) {
                H(3 * j, 3 * i) += d;
                H(3 * j + 1, 3 * i + 1) += d;
                H(3 * j + 2, 3 * i + 2) += d;
            }
            idx++;
        }
    }
}